

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  long lVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  bool bVar35;
  uint uVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  int iVar103;
  float fVar104;
  undefined4 uVar105;
  float fVar113;
  vint4 bi_2;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  vint4 bi_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  vint4 bi;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  float fVar130;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  vint4 ai_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  vint4 ai_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  vint4 ai;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  float fVar195;
  float fVar196;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar197;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  __m128 a;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  vfloat4 a0_2;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar224;
  float fVar234;
  float fVar235;
  vfloat4 a0_3;
  undefined1 auVar225 [16];
  float fVar236;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar249;
  vfloat4 b0_2;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  vfloat4 b0_3;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 in_ZMM18 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 in_ZMM24 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint auStack_440 [4];
  RTCFilterFunctionNArguments local_430;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar30;
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  float fVar144;
  float fVar152;
  undefined1 auVar262 [32];
  
  PVar6 = prim[1];
  uVar29 = (ulong)(byte)PVar6;
  lVar31 = uVar29 * 0x25;
  fVar104 = *(float *)(prim + lVar31 + 0x12);
  auVar42 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar42 = vsubps_avx(auVar42,*(undefined1 (*) [16])(prim + lVar31 + 6));
  auVar65._0_4_ = fVar104 * auVar42._0_4_;
  auVar65._4_4_ = fVar104 * auVar42._4_4_;
  auVar65._8_4_ = fVar104 * auVar42._8_4_;
  auVar65._12_4_ = fVar104 * auVar42._12_4_;
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 4 + 6)));
  auVar46._0_4_ = fVar104 * auVar43._0_4_;
  auVar46._4_4_ = fVar104 * auVar43._4_4_;
  auVar46._8_4_ = fVar104 * auVar43._8_4_;
  auVar46._12_4_ = fVar104 * auVar43._12_4_;
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 5 + 6)));
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 6 + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0xf + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar29 + 6)));
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar55 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0x1a + 6)));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar56 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0x1b + 6)));
  auVar56 = vcvtdq2ps_avx(auVar56);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar29 * 0x1c + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar153._4_4_ = auVar46._0_4_;
  auVar153._0_4_ = auVar46._0_4_;
  auVar153._8_4_ = auVar46._0_4_;
  auVar153._12_4_ = auVar46._0_4_;
  auVar59 = vshufps_avx(auVar46,auVar46,0x55);
  auVar60 = vshufps_avx(auVar46,auVar46,0xaa);
  fVar104 = auVar60._0_4_;
  auVar70._0_4_ = fVar104 * auVar44._0_4_;
  fVar113 = auVar60._4_4_;
  auVar70._4_4_ = fVar113 * auVar44._4_4_;
  fVar239 = auVar60._8_4_;
  auVar70._8_4_ = fVar239 * auVar44._8_4_;
  fVar224 = auVar60._12_4_;
  auVar70._12_4_ = fVar224 * auVar44._12_4_;
  auVar53._0_4_ = auVar54._0_4_ * fVar104;
  auVar53._4_4_ = auVar54._4_4_ * fVar113;
  auVar53._8_4_ = auVar54._8_4_ * fVar239;
  auVar53._12_4_ = auVar54._12_4_ * fVar224;
  auVar47._0_4_ = auVar58._0_4_ * fVar104;
  auVar47._4_4_ = auVar58._4_4_ * fVar113;
  auVar47._8_4_ = auVar58._8_4_ * fVar239;
  auVar47._12_4_ = auVar58._12_4_ * fVar224;
  auVar60 = vfmadd231ps_fma(auVar70,auVar59,auVar43);
  auVar61 = vfmadd231ps_fma(auVar53,auVar59,auVar57);
  auVar59 = vfmadd231ps_fma(auVar47,auVar56,auVar59);
  auVar62 = vfmadd231ps_fma(auVar60,auVar153,auVar42);
  auVar61 = vfmadd231ps_fma(auVar61,auVar153,auVar51);
  auVar63 = vfmadd231ps_fma(auVar59,auVar55,auVar153);
  auVar256._4_4_ = auVar65._0_4_;
  auVar256._0_4_ = auVar65._0_4_;
  auVar256._8_4_ = auVar65._0_4_;
  auVar256._12_4_ = auVar65._0_4_;
  auVar59 = vshufps_avx(auVar65,auVar65,0x55);
  auVar60 = vshufps_avx(auVar65,auVar65,0xaa);
  fVar104 = auVar60._0_4_;
  auVar154._0_4_ = fVar104 * auVar44._0_4_;
  fVar113 = auVar60._4_4_;
  auVar154._4_4_ = fVar113 * auVar44._4_4_;
  fVar239 = auVar60._8_4_;
  auVar154._8_4_ = fVar239 * auVar44._8_4_;
  fVar224 = auVar60._12_4_;
  auVar154._12_4_ = fVar224 * auVar44._12_4_;
  auVar68._0_4_ = auVar54._0_4_ * fVar104;
  auVar68._4_4_ = auVar54._4_4_ * fVar113;
  auVar68._8_4_ = auVar54._8_4_ * fVar239;
  auVar68._12_4_ = auVar54._12_4_ * fVar224;
  auVar67._0_4_ = auVar58._0_4_ * fVar104;
  auVar67._4_4_ = auVar58._4_4_ * fVar113;
  auVar67._8_4_ = auVar58._8_4_ * fVar239;
  auVar67._12_4_ = auVar58._12_4_ * fVar224;
  auVar43 = vfmadd231ps_fma(auVar154,auVar59,auVar43);
  auVar44 = vfmadd231ps_fma(auVar68,auVar59,auVar57);
  auVar57 = vfmadd231ps_fma(auVar67,auVar59,auVar56);
  auVar45 = vfmadd231ps_fma(auVar43,auVar256,auVar42);
  auVar46 = vfmadd231ps_fma(auVar44,auVar256,auVar51);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar274 = ZEXT1664(auVar42);
  auVar47 = vfmadd231ps_fma(auVar57,auVar256,auVar55);
  auVar43 = vandps_avx512vl(auVar62,auVar42);
  auVar187._8_4_ = 0x219392ef;
  auVar187._0_8_ = 0x219392ef219392ef;
  auVar187._12_4_ = 0x219392ef;
  uVar41 = vcmpps_avx512vl(auVar43,auVar187,1);
  bVar35 = (bool)((byte)uVar41 & 1);
  auVar48._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar62._0_4_;
  bVar35 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar62._4_4_;
  bVar35 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar62._8_4_;
  bVar35 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar48._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar62._12_4_;
  auVar43 = vandps_avx512vl(auVar61,auVar42);
  uVar41 = vcmpps_avx512vl(auVar43,auVar187,1);
  bVar35 = (bool)((byte)uVar41 & 1);
  auVar49._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar61._0_4_;
  bVar35 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar49._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar61._4_4_;
  bVar35 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar49._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar61._8_4_;
  bVar35 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar49._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar61._12_4_;
  auVar42 = vandps_avx512vl(auVar63,auVar42);
  uVar41 = vcmpps_avx512vl(auVar42,auVar187,1);
  bVar35 = (bool)((byte)uVar41 & 1);
  auVar50._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar63._0_4_;
  bVar35 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar50._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar63._4_4_;
  bVar35 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar50._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar63._8_4_;
  bVar35 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar50._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar63._12_4_;
  auVar42 = vrcp14ps_avx512vl(auVar48);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar275 = ZEXT1664(auVar43);
  auVar44 = vfnmadd213ps_avx512vl(auVar48,auVar42,auVar43);
  auVar62 = vfmadd132ps_fma(auVar44,auVar42,auVar42);
  auVar42 = vrcp14ps_avx512vl(auVar49);
  auVar44 = vfnmadd213ps_avx512vl(auVar49,auVar42,auVar43);
  auVar63 = vfmadd132ps_fma(auVar44,auVar42,auVar42);
  auVar42 = vrcp14ps_avx512vl(auVar50);
  auVar43 = vfnmadd213ps_avx512vl(auVar50,auVar42,auVar43);
  auVar20 = vfmadd132ps_fma(auVar43,auVar42,auVar42);
  fVar104 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar31 + 0x16)) *
            *(float *)(prim + lVar31 + 0x1a);
  auVar174._4_4_ = fVar104;
  auVar174._0_4_ = fVar104;
  auVar174._8_4_ = fVar104;
  auVar174._12_4_ = fVar104;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar29 * 7 + 6);
  auVar42 = vpmovsxwd_avx(auVar42);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar29 * 0xb + 6);
  auVar43 = vpmovsxwd_avx(auVar43);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar51 = vsubps_avx(auVar43,auVar42);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar29 * 9 + 6);
  auVar43 = vpmovsxwd_avx(auVar44);
  auVar44 = vfmadd213ps_fma(auVar51,auVar174,auVar42);
  auVar42 = vcvtdq2ps_avx(auVar43);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar29 * 0xd + 6);
  auVar43 = vpmovsxwd_avx(auVar51);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar42);
  auVar51 = vfmadd213ps_fma(auVar43,auVar174,auVar42);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar29 * 0x12 + 6);
  auVar42 = vpmovsxwd_avx(auVar57);
  auVar42 = vcvtdq2ps_avx(auVar42);
  uVar41 = (ulong)(uint)((int)(uVar29 * 5) << 2);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar29 * 2 + uVar41 + 6);
  auVar43 = vpmovsxwd_avx(auVar54);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar42);
  auVar57 = vfmadd213ps_fma(auVar43,auVar174,auVar42);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar41 + 6);
  auVar42 = vpmovsxwd_avx(auVar55);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar29 * 0x18 + 6);
  auVar43 = vpmovsxwd_avx(auVar56);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar42);
  auVar54 = vfmadd213ps_fma(auVar43,auVar174,auVar42);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar29 * 0x1d + 6);
  auVar42 = vpmovsxwd_avx(auVar58);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar29 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar43 = vpmovsxwd_avx(auVar59);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar42);
  auVar55 = vfmadd213ps_fma(auVar43,auVar174,auVar42);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar29) + 6);
  auVar42 = vpmovsxwd_avx(auVar60);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar29 * 0x23 + 6);
  auVar43 = vpmovsxwd_avx(auVar61);
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar43 = vsubps_avx(auVar43,auVar42);
  auVar43 = vfmadd213ps_fma(auVar43,auVar174,auVar42);
  auVar42 = vsubps_avx(auVar44,auVar45);
  auVar175._0_4_ = auVar62._0_4_ * auVar42._0_4_;
  auVar175._4_4_ = auVar62._4_4_ * auVar42._4_4_;
  auVar175._8_4_ = auVar62._8_4_ * auVar42._8_4_;
  auVar175._12_4_ = auVar62._12_4_ * auVar42._12_4_;
  auVar42 = vsubps_avx(auVar51,auVar45);
  auVar64._0_4_ = auVar62._0_4_ * auVar42._0_4_;
  auVar64._4_4_ = auVar62._4_4_ * auVar42._4_4_;
  auVar64._8_4_ = auVar62._8_4_ * auVar42._8_4_;
  auVar64._12_4_ = auVar62._12_4_ * auVar42._12_4_;
  auVar42 = vsubps_avx(auVar57,auVar46);
  auVar155._0_4_ = auVar63._0_4_ * auVar42._0_4_;
  auVar155._4_4_ = auVar63._4_4_ * auVar42._4_4_;
  auVar155._8_4_ = auVar63._8_4_ * auVar42._8_4_;
  auVar155._12_4_ = auVar63._12_4_ * auVar42._12_4_;
  auVar42 = vsubps_avx(auVar54,auVar46);
  auVar66._0_4_ = auVar63._0_4_ * auVar42._0_4_;
  auVar66._4_4_ = auVar63._4_4_ * auVar42._4_4_;
  auVar66._8_4_ = auVar63._8_4_ * auVar42._8_4_;
  auVar66._12_4_ = auVar63._12_4_ * auVar42._12_4_;
  auVar42 = vsubps_avx(auVar55,auVar47);
  auVar69._0_4_ = auVar20._0_4_ * auVar42._0_4_;
  auVar69._4_4_ = auVar20._4_4_ * auVar42._4_4_;
  auVar69._8_4_ = auVar20._8_4_ * auVar42._8_4_;
  auVar69._12_4_ = auVar20._12_4_ * auVar42._12_4_;
  auVar42 = vsubps_avx(auVar43,auVar47);
  auVar52._0_4_ = auVar20._0_4_ * auVar42._0_4_;
  auVar52._4_4_ = auVar20._4_4_ * auVar42._4_4_;
  auVar52._8_4_ = auVar20._8_4_ * auVar42._8_4_;
  auVar52._12_4_ = auVar20._12_4_ * auVar42._12_4_;
  auVar42 = vpminsd_avx(auVar175,auVar64);
  auVar43 = vpminsd_avx(auVar155,auVar66);
  auVar42 = vmaxps_avx(auVar42,auVar43);
  auVar43 = vpminsd_avx(auVar69,auVar52);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar62._4_4_ = uVar105;
  auVar62._0_4_ = uVar105;
  auVar62._8_4_ = uVar105;
  auVar62._12_4_ = uVar105;
  auVar43 = vmaxps_avx512vl(auVar43,auVar62);
  auVar42 = vmaxps_avx(auVar42,auVar43);
  auVar63._8_4_ = 0x3f7ffffa;
  auVar63._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar63._12_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar42,auVar63);
  auVar42 = vpmaxsd_avx(auVar175,auVar64);
  auVar43 = vpmaxsd_avx(auVar155,auVar66);
  auVar42 = vminps_avx(auVar42,auVar43);
  auVar43 = vpmaxsd_avx(auVar69,auVar52);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar20._4_4_ = uVar105;
  auVar20._0_4_ = uVar105;
  auVar20._8_4_ = uVar105;
  auVar20._12_4_ = uVar105;
  auVar43 = vminps_avx512vl(auVar43,auVar20);
  auVar42 = vminps_avx(auVar42,auVar43);
  auVar45._8_4_ = 0x3f800003;
  auVar45._0_8_ = 0x3f8000033f800003;
  auVar45._12_4_ = 0x3f800003;
  auVar42 = vmulps_avx512vl(auVar42,auVar45);
  auVar43 = vpbroadcastd_avx512vl();
  uVar18 = vcmpps_avx512vl(local_3a0,auVar42,2);
  uVar41 = vpcmpgtd_avx512vl(auVar43,_DAT_01f7fcf0);
  uVar41 = ((byte)uVar18 & 0xf) & uVar41;
  if ((char)uVar41 == '\0') {
    bVar35 = false;
  }
  else {
    local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar42 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
    auVar271 = ZEXT1664(auVar42);
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar277 = ZEXT1664(auVar42);
    do {
      lVar31 = 0;
      for (uVar29 = uVar41; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      uVar36 = *(uint *)(prim + 2);
      pGVar8 = (context->scene->geometries).items[uVar36].ptr;
      fVar104 = (pGVar8->time_range).lower;
      fVar235 = pGVar8->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar104) / ((pGVar8->time_range).upper - fVar104)
                );
      auVar42 = vroundss_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),9);
      auVar43 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),
                               SUB6416(ZEXT464(0xbf800000),0));
      auVar42 = vminss_avx(auVar42,auVar43);
      auVar45 = vmaxss_avx512f(auVar271._0_16_,auVar42);
      uVar29 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                               (ulong)*(uint *)(prim + lVar31 * 4 + 6) *
                               pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar33 = (long)(int)auVar45._0_4_ * 0x38;
      lVar10 = *(long *)(_Var9 + lVar33);
      lVar11 = *(long *)(_Var9 + 0x10 + lVar33);
      auVar42 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar29);
      lVar31 = uVar29 + 1;
      auVar43 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar31);
      lVar1 = uVar29 + 2;
      auVar44 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
      lVar2 = uVar29 + 3;
      auVar51 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
      lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
      lVar11 = *(long *)(lVar10 + lVar33);
      lVar12 = *(long *)(lVar10 + 0x10 + lVar33);
      auVar57 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar29);
      auVar54 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar31);
      auVar55 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
      auVar56 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
      lVar11 = *(long *)(_Var9 + 0x38 + lVar33);
      lVar12 = *(long *)(_Var9 + 0x48 + lVar33);
      auVar58 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar29);
      auVar59 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar31);
      auVar60 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
      auVar61 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
      local_1e0 = vpbroadcastd_avx512vl();
      lVar11 = *(long *)(lVar10 + 0x38 + lVar33);
      lVar10 = *(long *)(lVar10 + 0x48 + lVar33);
      auVar62 = *(undefined1 (*) [16])(lVar11 + uVar29 * lVar10);
      auVar63 = *(undefined1 (*) [16])(lVar11 + lVar31 * lVar10);
      auVar20 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar10);
      auVar89._16_16_ = local_1e0._16_16_;
      fVar235 = fVar235 - auVar45._0_4_;
      auVar89._0_16_ = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
      auVar45 = vmulps_avx512vl(auVar51,auVar89._0_16_);
      auVar114._8_4_ = 0x3e2aaaab;
      auVar114._0_8_ = 0x3e2aaaab3e2aaaab;
      auVar114._12_4_ = 0x3e2aaaab;
      auVar46 = vfmadd213ps_avx512vl(auVar114,auVar44,auVar45);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
      auVar46 = vfmadd231ps_avx512vl(auVar46,auVar43,auVar47);
      auVar46 = vfmadd231ps_avx512vl(auVar46,auVar42,auVar114);
      auVar66 = auVar277._0_16_;
      auVar45 = vfmadd231ps_avx512vl(auVar45,auVar44,auVar66);
      auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar43,auVar89._0_16_);
      auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar42,auVar66);
      auVar48 = vmulps_avx512vl(auVar56,auVar89._0_16_);
      auVar49 = vfmadd213ps_avx512vl(auVar114,auVar55,auVar48);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar54,auVar47);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar57,auVar114);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar55,auVar66);
      auVar48 = vfnmadd231ps_avx512vl(auVar48,auVar54,auVar89._0_16_);
      auVar48 = vfnmadd231ps_avx512vl(auVar48,auVar57,auVar66);
      auVar50 = vmulps_avx512vl(auVar51,auVar114);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar44,auVar47);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar43,auVar114);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar42,auVar89._0_16_);
      auVar51 = vmulps_avx512vl(auVar51,auVar66);
      auVar44 = vfmadd231ps_avx512vl(auVar51,auVar89._0_16_,auVar44);
      auVar43 = vfnmadd231ps_avx512vl(auVar44,auVar66,auVar43);
      auVar52 = vfnmadd231ps_avx512vl(auVar43,auVar89._0_16_,auVar42);
      auVar106._0_4_ = auVar56._0_4_ * 0.16666667;
      auVar106._4_4_ = auVar56._4_4_ * 0.16666667;
      auVar106._8_4_ = auVar56._8_4_ * 0.16666667;
      auVar106._12_4_ = auVar56._12_4_ * 0.16666667;
      auVar42 = vfmadd231ps_avx512vl(auVar106,auVar55,auVar47);
      auVar42 = vfmadd231ps_fma(auVar42,auVar54,auVar114);
      auVar53 = vfmadd231ps_avx512vl(auVar42,auVar57,auVar89._0_16_);
      auVar42 = vmulps_avx512vl(auVar56,auVar66);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar89._0_16_,auVar55);
      auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar66,auVar54);
      auVar54 = vfnmadd231ps_avx512vl(auVar42,auVar89._0_16_,auVar57);
      auVar42 = vshufps_avx(auVar45,auVar45,0xc9);
      auVar43 = vshufps_avx512vl(auVar49,auVar49,0xc9);
      fVar130 = auVar45._0_4_;
      auVar156._0_4_ = fVar130 * auVar43._0_4_;
      fVar141 = auVar45._4_4_;
      auVar156._4_4_ = fVar141 * auVar43._4_4_;
      fVar142 = auVar45._8_4_;
      auVar156._8_4_ = fVar142 * auVar43._8_4_;
      fVar143 = auVar45._12_4_;
      auVar156._12_4_ = fVar143 * auVar43._12_4_;
      auVar43 = vfmsub231ps_avx512vl(auVar156,auVar42,auVar49);
      auVar44 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar43 = vshufps_avx512vl(auVar48,auVar48,0xc9);
      auVar176._0_4_ = fVar130 * auVar43._0_4_;
      auVar176._4_4_ = fVar141 * auVar43._4_4_;
      auVar176._8_4_ = fVar142 * auVar43._8_4_;
      auVar176._12_4_ = fVar143 * auVar43._12_4_;
      auVar42 = vfmsub231ps_avx512vl(auVar176,auVar42,auVar48);
      auVar51 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar42 = vshufps_avx(auVar52,auVar52,0xc9);
      auVar43 = vshufps_avx(auVar53,auVar53,0xc9);
      fVar113 = auVar52._0_4_;
      auVar198._0_4_ = auVar43._0_4_ * fVar113;
      fVar239 = auVar52._4_4_;
      auVar198._4_4_ = auVar43._4_4_ * fVar239;
      fVar224 = auVar52._8_4_;
      auVar198._8_4_ = auVar43._8_4_ * fVar224;
      fVar234 = auVar52._12_4_;
      auVar198._12_4_ = auVar43._12_4_ * fVar234;
      auVar43 = vfmsub231ps_fma(auVar198,auVar42,auVar53);
      auVar57 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar43 = vshufps_avx(auVar54,auVar54,0xc9);
      auVar199._0_4_ = auVar43._0_4_ * fVar113;
      auVar199._4_4_ = auVar43._4_4_ * fVar239;
      auVar199._8_4_ = auVar43._8_4_ * fVar224;
      auVar199._12_4_ = auVar43._12_4_ * fVar234;
      auVar42 = vfmsub231ps_fma(auVar199,auVar42,auVar54);
      auVar54 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar42 = vdpps_avx(auVar44,auVar44,0x7f);
      auVar86._4_28_ = auVar89._4_28_;
      auVar86._0_4_ = auVar42._0_4_;
      auVar43 = vrsqrt14ss_avx512f(auVar89._0_16_,auVar86._0_16_);
      auVar55 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
      auVar56 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
      auVar56 = vmulss_avx512f(auVar56,auVar43);
      auVar43 = vmulss_avx512f(auVar56,ZEXT416((uint)(auVar43._0_4_ * auVar43._0_4_)));
      auVar43 = vaddss_avx512f(auVar55,auVar43);
      auVar206._0_4_ = auVar43._0_4_;
      auVar206._4_4_ = auVar206._0_4_;
      auVar206._8_4_ = auVar206._0_4_;
      auVar206._12_4_ = auVar206._0_4_;
      auVar55 = vmulps_avx512vl(auVar44,auVar206);
      auVar43 = vdpps_avx(auVar44,auVar51,0x7f);
      auVar56 = vbroadcastss_avx512vl(auVar42);
      auVar51 = vmulps_avx512vl(auVar56,auVar51);
      fVar104 = auVar43._0_4_;
      auVar157._0_4_ = fVar104 * auVar44._0_4_;
      auVar157._4_4_ = fVar104 * auVar44._4_4_;
      auVar157._8_4_ = fVar104 * auVar44._8_4_;
      auVar157._12_4_ = fVar104 * auVar44._12_4_;
      auVar44 = vsubps_avx(auVar51,auVar157);
      auVar43 = vrcp14ss_avx512f(auVar89._0_16_,auVar86._0_16_);
      auVar42 = vfnmadd213ss_avx512f(auVar42,auVar43,ZEXT416(0x40000000));
      fVar144 = auVar43._0_4_ * auVar42._0_4_;
      auVar42 = vdpps_avx(auVar57,auVar57,0x7f);
      auVar88._16_16_ = auVar89._16_16_;
      auVar88._0_16_ = auVar89._0_16_;
      auVar71._4_28_ = auVar88._4_28_;
      auVar71._0_4_ = auVar42._0_4_;
      auVar43 = vrsqrt14ss_avx512f(auVar89._0_16_,auVar71._0_16_);
      auVar51 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
      auVar56 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
      fVar104 = auVar43._0_4_;
      fVar104 = auVar51._0_4_ + auVar56._0_4_ * fVar104 * fVar104 * fVar104;
      auVar207._0_4_ = fVar104 * auVar57._0_4_;
      auVar207._4_4_ = fVar104 * auVar57._4_4_;
      auVar207._8_4_ = fVar104 * auVar57._8_4_;
      auVar207._12_4_ = fVar104 * auVar57._12_4_;
      auVar43 = vdpps_avx(auVar57,auVar54,0x7f);
      auVar51 = vbroadcastss_avx512vl(auVar42);
      auVar51 = vmulps_avx512vl(auVar51,auVar54);
      fVar152 = auVar43._0_4_;
      auVar107._0_4_ = fVar152 * auVar57._0_4_;
      auVar107._4_4_ = fVar152 * auVar57._4_4_;
      auVar107._8_4_ = fVar152 * auVar57._8_4_;
      auVar107._12_4_ = fVar152 * auVar57._12_4_;
      auVar43 = vsubps_avx(auVar51,auVar107);
      auVar51 = vrcp14ss_avx512f(auVar89._0_16_,auVar71._0_16_);
      auVar42 = vfnmadd213ss_avx512f(auVar42,auVar51,ZEXT416(0x40000000));
      fVar152 = auVar51._0_4_ * auVar42._0_4_;
      auVar51 = vshufps_avx512vl(auVar46,auVar46,0xff);
      auVar57 = vmulps_avx512vl(auVar51,auVar55);
      auVar56 = vsubps_avx512vl(auVar46,auVar57);
      auVar42 = vshufps_avx(auVar45,auVar45,0xff);
      auVar42 = vmulps_avx512vl(auVar42,auVar55);
      auVar145._0_4_ = auVar42._0_4_ + auVar51._0_4_ * auVar206._0_4_ * fVar144 * auVar44._0_4_;
      auVar145._4_4_ = auVar42._4_4_ + auVar51._4_4_ * auVar206._0_4_ * fVar144 * auVar44._4_4_;
      auVar145._8_4_ = auVar42._8_4_ + auVar51._8_4_ * auVar206._0_4_ * fVar144 * auVar44._8_4_;
      auVar145._12_4_ = auVar42._12_4_ + auVar51._12_4_ * auVar206._0_4_ * fVar144 * auVar44._12_4_;
      auVar42 = vsubps_avx(auVar45,auVar145);
      auVar55 = vaddps_avx512vl(auVar46,auVar57);
      auVar44 = vshufps_avx512vl(auVar50,auVar50,0xff);
      auVar250._0_4_ = auVar207._0_4_ * auVar44._0_4_;
      auVar250._4_4_ = auVar207._4_4_ * auVar44._4_4_;
      auVar250._8_4_ = auVar207._8_4_ * auVar44._8_4_;
      auVar250._12_4_ = auVar207._12_4_ * auVar44._12_4_;
      auVar45 = vsubps_avx512vl(auVar50,auVar250);
      auVar51 = vshufps_avx512vl(auVar52,auVar52,0xff);
      auVar51 = vmulps_avx512vl(auVar51,auVar207);
      auVar158._0_4_ = auVar51._0_4_ + auVar44._0_4_ * fVar104 * auVar43._0_4_ * fVar152;
      auVar158._4_4_ = auVar51._4_4_ + auVar44._4_4_ * fVar104 * auVar43._4_4_ * fVar152;
      auVar158._8_4_ = auVar51._8_4_ + auVar44._8_4_ * fVar104 * auVar43._8_4_ * fVar152;
      auVar158._12_4_ = auVar51._12_4_ + auVar44._12_4_ * fVar104 * auVar43._12_4_ * fVar152;
      auVar43 = vsubps_avx(auVar52,auVar158);
      auVar46 = vaddps_avx512vl(auVar50,auVar250);
      auVar188._0_4_ = auVar56._0_4_ + auVar42._0_4_ * 0.33333334;
      auVar188._4_4_ = auVar56._4_4_ + auVar42._4_4_ * 0.33333334;
      auVar188._8_4_ = auVar56._8_4_ + auVar42._8_4_ * 0.33333334;
      auVar188._12_4_ = auVar56._12_4_ + auVar42._12_4_ * 0.33333334;
      auVar159._0_4_ = auVar43._0_4_ * 0.33333334;
      auVar159._4_4_ = auVar43._4_4_ * 0.33333334;
      auVar159._8_4_ = auVar43._8_4_ * 0.33333334;
      auVar159._12_4_ = auVar43._12_4_ * 0.33333334;
      auVar57 = vsubps_avx(auVar45,auVar159);
      auVar160._0_4_ = (fVar130 + auVar145._0_4_) * 0.33333334;
      auVar160._4_4_ = (fVar141 + auVar145._4_4_) * 0.33333334;
      auVar160._8_4_ = (fVar142 + auVar145._8_4_) * 0.33333334;
      auVar160._12_4_ = (fVar143 + auVar145._12_4_) * 0.33333334;
      auVar48 = vaddps_avx512vl(auVar55,auVar160);
      auVar177._0_4_ = (fVar113 + auVar158._0_4_) * 0.33333334;
      auVar177._4_4_ = (fVar239 + auVar158._4_4_) * 0.33333334;
      auVar177._8_4_ = (fVar224 + auVar158._8_4_) * 0.33333334;
      auVar177._12_4_ = (fVar234 + auVar158._12_4_) * 0.33333334;
      auVar54 = vsubps_avx(auVar46,auVar177);
      auVar42 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
      auVar43 = vmulps_avx512vl(auVar61,auVar89._0_16_);
      auVar44 = vfmadd213ps_avx512vl(auVar114,auVar60,auVar43);
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar59,auVar47);
      auVar49 = vfmadd231ps_avx512vl(auVar44,auVar58,auVar114);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar60,auVar66);
      auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar59,auVar89._0_16_);
      auVar50 = vfnmadd231ps_avx512vl(auVar43,auVar58,auVar66);
      auVar43 = vmulps_avx512vl(auVar42,auVar89._0_16_);
      auVar44 = vfmadd213ps_avx512vl(auVar114,auVar20,auVar43);
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar63,auVar47);
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar62,auVar114);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar20,auVar66);
      auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar63,auVar89._0_16_);
      auVar51 = vfnmadd231ps_avx512vl(auVar43,auVar62,auVar66);
      auVar43 = vmulps_avx512vl(auVar61,auVar114);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar60,auVar47);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar59,auVar114);
      auVar52 = vfmadd231ps_avx512vl(auVar43,auVar58,auVar89._0_16_);
      auVar43 = vmulps_avx512vl(auVar61,auVar66);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar89._0_16_,auVar60);
      auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar66,auVar59);
      auVar58 = vfnmadd231ps_avx512vl(auVar43,auVar89._0_16_,auVar58);
      auVar43 = vmulps_avx512vl(auVar42,auVar114);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar20,auVar47);
      auVar43 = vfmadd231ps_fma(auVar43,auVar63,auVar114);
      auVar59 = vfmadd231ps_avx512vl(auVar43,auVar62,auVar89._0_16_);
      auVar42 = vmulps_avx512vl(auVar42,auVar66);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar89._0_16_,auVar20);
      auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar66,auVar63);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar60 = vfnmadd231ps_avx512vl(auVar42,auVar89._0_16_,auVar62);
      auVar42 = vshufps_avx(auVar50,auVar50,0xc9);
      auVar43 = vshufps_avx512vl(auVar44,auVar44,0xc9);
      fVar239 = auVar50._0_4_;
      auVar257._0_4_ = fVar239 * auVar43._0_4_;
      fVar224 = auVar50._4_4_;
      auVar257._4_4_ = fVar224 * auVar43._4_4_;
      fVar234 = auVar50._8_4_;
      auVar257._8_4_ = fVar234 * auVar43._8_4_;
      fVar144 = auVar50._12_4_;
      auVar257._12_4_ = fVar144 * auVar43._12_4_;
      auVar43 = vfmsub231ps_avx512vl(auVar257,auVar42,auVar44);
      auVar44 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar43 = vshufps_avx512vl(auVar51,auVar51,0xc9);
      auVar263._0_4_ = fVar239 * auVar43._0_4_;
      auVar263._4_4_ = fVar224 * auVar43._4_4_;
      auVar263._8_4_ = fVar234 * auVar43._8_4_;
      auVar263._12_4_ = fVar144 * auVar43._12_4_;
      auVar42 = vfmsub231ps_avx512vl(auVar263,auVar42,auVar51);
      auVar51 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar43 = vshufps_avx(auVar58,auVar58,0xc9);
      auVar42 = vshufps_avx512vl(auVar59,auVar59,0xc9);
      auVar42 = vmulps_avx512vl(auVar58,auVar42);
      auVar42 = vfmsub231ps_avx512vl(auVar42,auVar43,auVar59);
      auVar59 = vshufps_avx512vl(auVar42,auVar42,0xc9);
      auVar61 = vshufps_avx512vl(auVar60,auVar60,0xc9);
      auVar42 = vdpps_avx(auVar44,auVar44,0x7f);
      auVar61 = vmulps_avx512vl(auVar58,auVar61);
      auVar43 = vfmsub231ps_avx512vl(auVar61,auVar43,auVar60);
      auVar60 = vshufps_avx512vl(auVar43,auVar43,0xc9);
      auVar72._16_16_ = auVar89._16_16_;
      auVar72._0_16_ = auVar89._0_16_;
      auVar73._4_28_ = auVar72._4_28_;
      auVar73._0_4_ = auVar42._0_4_;
      auVar43 = vrsqrt14ss_avx512f(auVar89._0_16_,auVar73._0_16_);
      auVar61 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
      auVar62 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
      auVar62 = vmulss_avx512f(auVar62,auVar43);
      auVar43 = vmulss_avx512f(auVar43,auVar43);
      auVar43 = vmulss_avx512f(auVar62,auVar43);
      auVar43 = vaddss_avx512f(auVar61,auVar43);
      auVar61 = vbroadcastss_avx512vl(auVar43);
      auVar62 = vmulps_avx512vl(auVar44,auVar61);
      auVar43 = vdpps_avx(auVar44,auVar51,0x7f);
      auVar63 = vbroadcastss_avx512vl(auVar42);
      auVar51 = vmulps_avx512vl(auVar63,auVar51);
      fVar104 = auVar43._0_4_;
      auVar161._0_4_ = auVar44._0_4_ * fVar104;
      auVar161._4_4_ = auVar44._4_4_ * fVar104;
      auVar161._8_4_ = auVar44._8_4_ * fVar104;
      auVar161._12_4_ = auVar44._12_4_ * fVar104;
      auVar43 = vsubps_avx(auVar51,auVar161);
      auVar44 = vrcp14ss_avx512f(auVar89._0_16_,auVar73._0_16_);
      auVar42 = vfnmadd213ss_avx512f(auVar42,auVar44,ZEXT416(0x40000000));
      fVar104 = auVar44._0_4_ * auVar42._0_4_;
      auVar42 = vdpps_avx(auVar59,auVar59,0x7f);
      auVar115._0_4_ = fVar104 * auVar43._0_4_;
      auVar115._4_4_ = fVar104 * auVar43._4_4_;
      auVar115._8_4_ = fVar104 * auVar43._8_4_;
      auVar115._12_4_ = fVar104 * auVar43._12_4_;
      auVar44 = vmulps_avx512vl(auVar61,auVar115);
      auVar75._16_16_ = auVar89._16_16_;
      auVar75._0_16_ = auVar89._0_16_;
      auVar74._4_28_ = auVar75._4_28_;
      auVar74._0_4_ = auVar42._0_4_;
      auVar43 = vrsqrt14ss_avx512f(auVar89._0_16_,auVar74._0_16_);
      auVar51 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
      auVar276 = ZEXT464(0x3f800000);
      auVar61 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
      auVar61 = vmulss_avx512f(auVar61,auVar43);
      auVar43 = vmulss_avx512f(auVar61,ZEXT416((uint)(auVar43._0_4_ * auVar43._0_4_)));
      fVar104 = auVar51._0_4_ + auVar43._0_4_;
      auVar264._0_4_ = auVar59._0_4_ * fVar104;
      auVar264._4_4_ = auVar59._4_4_ * fVar104;
      auVar264._8_4_ = auVar59._8_4_ * fVar104;
      auVar264._12_4_ = auVar59._12_4_ * fVar104;
      auVar43 = vdpps_avx(auVar59,auVar60,0x7f);
      auVar51 = vbroadcastss_avx512vl(auVar42);
      auVar51 = vmulps_avx512vl(auVar51,auVar60);
      fVar113 = auVar43._0_4_;
      auVar178._0_4_ = auVar59._0_4_ * fVar113;
      auVar178._4_4_ = auVar59._4_4_ * fVar113;
      auVar178._8_4_ = auVar59._8_4_ * fVar113;
      auVar178._12_4_ = auVar59._12_4_ * fVar113;
      auVar43 = vsubps_avx(auVar51,auVar178);
      auVar51 = vrcp14ss_avx512f(auVar89._0_16_,auVar74._0_16_);
      auVar42 = vfnmadd213ss_avx512f(auVar42,auVar51,ZEXT416(0x40000000));
      fVar113 = auVar42._0_4_ * auVar51._0_4_;
      auVar51 = vshufps_avx512vl(auVar49,auVar49,0xff);
      auVar59 = vmulps_avx512vl(auVar51,auVar62);
      auVar60 = vsubps_avx512vl(auVar49,auVar59);
      auVar42 = vshufps_avx(auVar50,auVar50,0xff);
      auVar42 = vmulps_avx512vl(auVar42,auVar62);
      auVar116._0_4_ = auVar42._0_4_ + auVar51._0_4_ * auVar44._0_4_;
      auVar116._4_4_ = auVar42._4_4_ + auVar51._4_4_ * auVar44._4_4_;
      auVar116._8_4_ = auVar42._8_4_ + auVar51._8_4_ * auVar44._8_4_;
      auVar116._12_4_ = auVar42._12_4_ + auVar51._12_4_ * auVar44._12_4_;
      auVar42 = vsubps_avx(auVar50,auVar116);
      auVar44 = vaddps_avx512vl(auVar49,auVar59);
      auVar51 = vshufps_avx512vl(auVar52,auVar52,0xff);
      auVar241._0_4_ = auVar51._0_4_ * auVar264._0_4_;
      auVar241._4_4_ = auVar51._4_4_ * auVar264._4_4_;
      auVar241._8_4_ = auVar51._8_4_ * auVar264._8_4_;
      auVar241._12_4_ = auVar51._12_4_ * auVar264._12_4_;
      auVar59 = vsubps_avx512vl(auVar52,auVar241);
      auVar61 = vshufps_avx512vl(auVar58,auVar58,0xff);
      auVar61 = vmulps_avx512vl(auVar61,auVar264);
      auVar162._0_4_ = auVar61._0_4_ + auVar51._0_4_ * fVar104 * auVar43._0_4_ * fVar113;
      auVar162._4_4_ = auVar61._4_4_ + auVar51._4_4_ * fVar104 * auVar43._4_4_ * fVar113;
      auVar162._8_4_ = auVar61._8_4_ + auVar51._8_4_ * fVar104 * auVar43._8_4_ * fVar113;
      auVar162._12_4_ = auVar61._12_4_ + auVar51._12_4_ * fVar104 * auVar43._12_4_ * fVar113;
      auVar43 = vsubps_avx(auVar58,auVar162);
      auVar51 = vaddps_avx512vl(auVar52,auVar241);
      auVar179._0_4_ = auVar60._0_4_ + auVar42._0_4_ * 0.33333334;
      auVar179._4_4_ = auVar60._4_4_ + auVar42._4_4_ * 0.33333334;
      auVar179._8_4_ = auVar60._8_4_ + auVar42._8_4_ * 0.33333334;
      auVar179._12_4_ = auVar60._12_4_ + auVar42._12_4_ * 0.33333334;
      auVar208._0_4_ = auVar43._0_4_ * 0.33333334;
      auVar208._4_4_ = auVar43._4_4_ * 0.33333334;
      auVar208._8_4_ = auVar43._8_4_ * 0.33333334;
      auVar208._12_4_ = auVar43._12_4_ * 0.33333334;
      auVar42 = vsubps_avx(auVar59,auVar208);
      auVar117._0_4_ = auVar44._0_4_ + (fVar239 + auVar116._0_4_) * 0.33333334;
      auVar117._4_4_ = auVar44._4_4_ + (fVar224 + auVar116._4_4_) * 0.33333334;
      auVar117._8_4_ = auVar44._8_4_ + (fVar234 + auVar116._8_4_) * 0.33333334;
      auVar117._12_4_ = auVar44._12_4_ + (fVar144 + auVar116._12_4_) * 0.33333334;
      auVar163._0_4_ = (auVar58._0_4_ + auVar162._0_4_) * 0.33333334;
      auVar163._4_4_ = (auVar58._4_4_ + auVar162._4_4_) * 0.33333334;
      auVar163._8_4_ = (auVar58._8_4_ + auVar162._8_4_) * 0.33333334;
      auVar163._12_4_ = (auVar58._12_4_ + auVar162._12_4_) * 0.33333334;
      auVar43 = vsubps_avx(auVar51,auVar163);
      auVar251._4_4_ = fVar235;
      auVar251._0_4_ = fVar235;
      auVar251._8_4_ = fVar235;
      auVar251._12_4_ = fVar235;
      auVar58 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar235));
      auVar265._0_4_ = auVar58._0_4_;
      auVar265._4_4_ = auVar265._0_4_;
      auVar265._8_4_ = auVar265._0_4_;
      auVar265._12_4_ = auVar265._0_4_;
      auVar58 = vmulps_avx512vl(auVar251,auVar60);
      auVar60 = vmulps_avx512vl(auVar251,auVar179);
      auVar42 = vmulps_avx512vl(auVar251,auVar42);
      auVar258._0_4_ = fVar235 * auVar59._0_4_;
      auVar258._4_4_ = fVar235 * auVar59._4_4_;
      auVar258._8_4_ = fVar235 * auVar59._8_4_;
      auVar258._12_4_ = fVar235 * auVar59._12_4_;
      local_320 = vfmadd231ps_avx512vl(auVar58,auVar265,auVar56);
      local_330 = vfmadd231ps_avx512vl(auVar60,auVar265,auVar188);
      local_340 = vfmadd231ps_avx512vl(auVar42,auVar265,auVar57);
      local_350 = vfmadd231ps_fma(auVar258,auVar265,auVar45);
      auVar42 = vmulps_avx512vl(auVar251,auVar44);
      auVar44 = vmulps_avx512vl(auVar251,auVar117);
      auVar43 = vmulps_avx512vl(auVar251,auVar43);
      auVar252._0_4_ = fVar235 * auVar51._0_4_;
      auVar252._4_4_ = fVar235 * auVar51._4_4_;
      auVar252._8_4_ = fVar235 * auVar51._8_4_;
      auVar252._12_4_ = fVar235 * auVar51._12_4_;
      _local_360 = vfmadd231ps_avx512vl(auVar42,auVar265,auVar55);
      _local_370 = vfmadd231ps_avx512vl(auVar44,auVar265,auVar48);
      _local_380 = vfmadd231ps_avx512vl(auVar43,auVar265,auVar54);
      _local_390 = vfmadd231ps_fma(auVar252,auVar265,auVar46);
      auVar42 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      local_2a0 = vsubps_avx512vl(local_320,auVar42);
      uVar105 = local_2a0._0_4_;
      auVar118._4_4_ = uVar105;
      auVar118._0_4_ = uVar105;
      auVar118._8_4_ = uVar105;
      auVar118._12_4_ = uVar105;
      auVar43 = vshufps_avx(local_2a0,local_2a0,0x55);
      auVar44 = vshufps_avx(local_2a0,local_2a0,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar104 = pre->ray_space[k].vz.field_0.m128[0];
      fVar113 = pre->ray_space[k].vz.field_0.m128[1];
      fVar239 = pre->ray_space[k].vz.field_0.m128[2];
      fVar224 = pre->ray_space[k].vz.field_0.m128[3];
      auVar108._0_4_ = fVar104 * auVar44._0_4_;
      auVar108._4_4_ = fVar113 * auVar44._4_4_;
      auVar108._8_4_ = fVar239 * auVar44._8_4_;
      auVar108._12_4_ = fVar224 * auVar44._12_4_;
      auVar43 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar5,auVar43);
      auVar56 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar118);
      local_2b0 = vsubps_avx512vl(local_330,auVar42);
      uVar105 = local_2b0._0_4_;
      auVar131._4_4_ = uVar105;
      auVar131._0_4_ = uVar105;
      auVar131._8_4_ = uVar105;
      auVar131._12_4_ = uVar105;
      auVar43 = vshufps_avx(local_2b0,local_2b0,0x55);
      auVar44 = vshufps_avx(local_2b0,local_2b0,0xaa);
      auVar119._0_4_ = fVar104 * auVar44._0_4_;
      auVar119._4_4_ = fVar113 * auVar44._4_4_;
      auVar119._8_4_ = fVar239 * auVar44._8_4_;
      auVar119._12_4_ = fVar224 * auVar44._12_4_;
      auVar43 = vfmadd231ps_fma(auVar119,(undefined1  [16])aVar5,auVar43);
      auVar58 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar131);
      local_2c0 = vsubps_avx512vl(local_340,auVar42);
      uVar105 = local_2c0._0_4_;
      auVar132._4_4_ = uVar105;
      auVar132._0_4_ = uVar105;
      auVar132._8_4_ = uVar105;
      auVar132._12_4_ = uVar105;
      auVar43 = vshufps_avx(local_2c0,local_2c0,0x55);
      auVar44 = vshufps_avx(local_2c0,local_2c0,0xaa);
      auVar200._0_4_ = auVar44._0_4_ * fVar104;
      auVar200._4_4_ = auVar44._4_4_ * fVar113;
      auVar200._8_4_ = auVar44._8_4_ * fVar239;
      auVar200._12_4_ = auVar44._12_4_ * fVar224;
      auVar43 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar5,auVar43);
      auVar59 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar132);
      local_2d0 = vsubps_avx(local_350,auVar42);
      uVar105 = local_2d0._0_4_;
      auVar133._4_4_ = uVar105;
      auVar133._0_4_ = uVar105;
      auVar133._8_4_ = uVar105;
      auVar133._12_4_ = uVar105;
      auVar43 = vshufps_avx(local_2d0,local_2d0,0x55);
      auVar44 = vshufps_avx(local_2d0,local_2d0,0xaa);
      auVar209._0_4_ = auVar44._0_4_ * fVar104;
      auVar209._4_4_ = auVar44._4_4_ * fVar113;
      auVar209._8_4_ = auVar44._8_4_ * fVar239;
      auVar209._12_4_ = auVar44._12_4_ * fVar224;
      auVar43 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar5,auVar43);
      auVar60 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar133);
      local_2e0 = vsubps_avx512vl(_local_360,auVar42);
      uVar105 = local_2e0._0_4_;
      auVar134._4_4_ = uVar105;
      auVar134._0_4_ = uVar105;
      auVar134._8_4_ = uVar105;
      auVar134._12_4_ = uVar105;
      auVar43 = vshufps_avx(local_2e0,local_2e0,0x55);
      auVar44 = vshufps_avx(local_2e0,local_2e0,0xaa);
      auVar219._0_4_ = auVar44._0_4_ * fVar104;
      auVar219._4_4_ = auVar44._4_4_ * fVar113;
      auVar219._8_4_ = auVar44._8_4_ * fVar239;
      auVar219._12_4_ = auVar44._12_4_ * fVar224;
      auVar43 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar5,auVar43);
      auVar61 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar134);
      local_2f0 = vsubps_avx512vl(_local_370,auVar42);
      uVar105 = local_2f0._0_4_;
      auVar135._4_4_ = uVar105;
      auVar135._0_4_ = uVar105;
      auVar135._8_4_ = uVar105;
      auVar135._12_4_ = uVar105;
      auVar43 = vshufps_avx(local_2f0,local_2f0,0x55);
      auVar44 = vshufps_avx(local_2f0,local_2f0,0xaa);
      auVar225._0_4_ = auVar44._0_4_ * fVar104;
      auVar225._4_4_ = auVar44._4_4_ * fVar113;
      auVar225._8_4_ = auVar44._8_4_ * fVar239;
      auVar225._12_4_ = auVar44._12_4_ * fVar224;
      auVar43 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar5,auVar43);
      auVar62 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar135);
      local_300 = vsubps_avx512vl(_local_380,auVar42);
      uVar105 = local_300._0_4_;
      auVar136._4_4_ = uVar105;
      auVar136._0_4_ = uVar105;
      auVar136._8_4_ = uVar105;
      auVar136._12_4_ = uVar105;
      auVar43 = vshufps_avx(local_300,local_300,0x55);
      auVar44 = vshufps_avx(local_300,local_300,0xaa);
      auVar242._0_4_ = auVar44._0_4_ * fVar104;
      auVar242._4_4_ = auVar44._4_4_ * fVar113;
      auVar242._8_4_ = auVar44._8_4_ * fVar239;
      auVar242._12_4_ = auVar44._12_4_ * fVar224;
      auVar43 = vfmadd231ps_fma(auVar242,(undefined1  [16])aVar5,auVar43);
      auVar63 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar4,auVar136);
      local_310 = vsubps_avx(_local_390,auVar42);
      uVar105 = local_310._0_4_;
      auVar123._4_4_ = uVar105;
      auVar123._0_4_ = uVar105;
      auVar123._8_4_ = uVar105;
      auVar123._12_4_ = uVar105;
      auVar42 = vshufps_avx(local_310,local_310,0x55);
      auVar43 = vshufps_avx(local_310,local_310,0xaa);
      auVar180._0_4_ = fVar104 * auVar43._0_4_;
      auVar180._4_4_ = fVar113 * auVar43._4_4_;
      auVar180._8_4_ = fVar239 * auVar43._8_4_;
      auVar180._12_4_ = fVar224 * auVar43._12_4_;
      auVar42 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar5,auVar42);
      auVar20 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar123);
      auVar44 = vmovlhps_avx(auVar56,auVar61);
      auVar51 = vmovlhps_avx(auVar58,auVar62);
      auVar57 = vmovlhps_avx(auVar59,auVar63);
      auVar55 = vmovlhps_avx512f(auVar60,auVar20);
      auVar43 = vminps_avx(auVar44,auVar51);
      auVar42 = vmaxps_avx(auVar44,auVar51);
      auVar54 = vminps_avx512vl(auVar57,auVar55);
      auVar43 = vminps_avx(auVar43,auVar54);
      auVar54 = vmaxps_avx512vl(auVar57,auVar55);
      auVar42 = vmaxps_avx(auVar42,auVar54);
      auVar54 = vshufpd_avx(auVar43,auVar43,3);
      auVar43 = vminps_avx(auVar43,auVar54);
      auVar54 = vshufpd_avx(auVar42,auVar42,3);
      auVar42 = vmaxps_avx(auVar42,auVar54);
      auVar43 = vandps_avx512vl(auVar43,auVar274._0_16_);
      auVar42 = vandps_avx512vl(auVar42,auVar274._0_16_);
      auVar42 = vmaxps_avx(auVar43,auVar42);
      auVar43 = vmovshdup_avx(auVar42);
      auVar42 = vmaxss_avx(auVar43,auVar42);
      fVar113 = auVar42._0_4_ * 9.536743e-07;
      auVar43 = vmovddup_avx512vl(auVar56);
      auVar54 = vmovddup_avx512vl(auVar58);
      auVar201._0_8_ = auVar59._0_8_;
      auVar201._8_8_ = auVar201._0_8_;
      auVar210._0_8_ = auVar60._0_8_;
      auVar210._8_8_ = auVar210._0_8_;
      auVar120._4_4_ = fVar113;
      auVar120._0_4_ = fVar113;
      auVar120._8_4_ = fVar113;
      auVar120._12_4_ = fVar113;
      local_260._16_4_ = fVar113;
      local_260._0_16_ = auVar120;
      local_260._20_4_ = fVar113;
      local_260._24_4_ = fVar113;
      local_260._28_4_ = fVar113;
      auVar42 = vxorps_avx512vl(auVar120,auVar47);
      local_1c0 = auVar42._0_4_;
      uStack_1bc = local_1c0;
      uStack_1b8 = local_1c0;
      uStack_1b4 = local_1c0;
      uStack_1b0 = local_1c0;
      uStack_1ac = local_1c0;
      uStack_1a8 = local_1c0;
      uStack_1a4 = local_1c0;
      bVar35 = false;
      uVar29 = 0;
      fVar104 = *(float *)(ray + k * 4 + 0x60);
      local_270 = vsubps_avx(auVar51,auVar44);
      local_280 = vsubps_avx(auVar57,auVar51);
      local_290 = vsubps_avx512vl(auVar55,auVar57);
      local_3b0 = vsubps_avx512vl(_local_360,local_320);
      local_3c0 = vsubps_avx512vl(_local_370,local_330);
      local_3d0 = vsubps_avx512vl(_local_380,local_340);
      _local_3e0 = vsubps_avx(_local_390,local_350);
      local_200 = vpbroadcastd_avx512vl();
      auVar42 = ZEXT816(0x3f80000000000000);
      auVar121 = auVar42;
LAB_01bcb8d5:
      auVar56 = vshufps_avx(auVar121,auVar121,0x50);
      auVar259._8_4_ = 0x3f800000;
      auVar259._0_8_ = 0x3f8000003f800000;
      auVar259._12_4_ = 0x3f800000;
      auVar262._16_4_ = 0x3f800000;
      auVar262._0_16_ = auVar259;
      auVar262._20_4_ = 0x3f800000;
      auVar262._24_4_ = 0x3f800000;
      auVar262._28_4_ = 0x3f800000;
      auVar58 = vsubps_avx(auVar259,auVar56);
      fVar239 = auVar56._0_4_;
      fVar144 = auVar61._0_4_;
      auVar146._0_4_ = fVar144 * fVar239;
      fVar224 = auVar56._4_4_;
      fVar152 = auVar61._4_4_;
      auVar146._4_4_ = fVar152 * fVar224;
      fVar234 = auVar56._8_4_;
      auVar146._8_4_ = fVar144 * fVar234;
      fVar235 = auVar56._12_4_;
      auVar146._12_4_ = fVar152 * fVar235;
      fVar130 = auVar62._0_4_;
      auVar164._0_4_ = fVar130 * fVar239;
      fVar141 = auVar62._4_4_;
      auVar164._4_4_ = fVar141 * fVar224;
      auVar164._8_4_ = fVar130 * fVar234;
      auVar164._12_4_ = fVar141 * fVar235;
      fVar142 = auVar63._0_4_;
      auVar181._0_4_ = fVar142 * fVar239;
      fVar143 = auVar63._4_4_;
      auVar181._4_4_ = fVar143 * fVar224;
      auVar181._8_4_ = fVar142 * fVar234;
      auVar181._12_4_ = fVar143 * fVar235;
      fVar240 = auVar20._0_4_;
      auVar124._0_4_ = fVar240 * fVar239;
      fVar249 = auVar20._4_4_;
      auVar124._4_4_ = fVar249 * fVar224;
      auVar124._8_4_ = fVar240 * fVar234;
      auVar124._12_4_ = fVar249 * fVar235;
      auVar60 = vfmadd231ps_avx512vl(auVar146,auVar58,auVar43);
      auVar45 = vfmadd231ps_avx512vl(auVar164,auVar58,auVar54);
      auVar59 = vfmadd231ps_fma(auVar181,auVar58,auVar201);
      auVar58 = vfmadd231ps_fma(auVar124,auVar210,auVar58);
      auVar56 = vmovshdup_avx(auVar42);
      fVar224 = auVar42._0_4_;
      fVar239 = (auVar56._0_4_ - fVar224) * 0.04761905;
      auVar149._4_4_ = fVar224;
      auVar149._0_4_ = fVar224;
      auVar149._8_4_ = fVar224;
      auVar149._12_4_ = fVar224;
      auVar149._16_4_ = fVar224;
      auVar149._20_4_ = fVar224;
      auVar149._24_4_ = fVar224;
      auVar149._28_4_ = fVar224;
      auVar81._0_8_ = auVar56._0_8_;
      auVar81._8_8_ = auVar81._0_8_;
      auVar81._16_8_ = auVar81._0_8_;
      auVar81._24_8_ = auVar81._0_8_;
      auVar89 = vsubps_avx(auVar81,auVar149);
      uVar105 = auVar60._0_4_;
      auVar91._4_4_ = uVar105;
      auVar91._0_4_ = uVar105;
      auVar91._8_4_ = uVar105;
      auVar91._12_4_ = uVar105;
      auVar91._16_4_ = uVar105;
      auVar91._20_4_ = uVar105;
      auVar91._24_4_ = uVar105;
      auVar91._28_4_ = uVar105;
      auVar84._8_4_ = 1;
      auVar84._0_8_ = 0x100000001;
      auVar84._12_4_ = 1;
      auVar84._16_4_ = 1;
      auVar84._20_4_ = 1;
      auVar84._24_4_ = 1;
      auVar84._28_4_ = 1;
      auVar88 = ZEXT1632(auVar60);
      auVar86 = vpermps_avx2(auVar84,auVar88);
      auVar71 = vbroadcastss_avx512vl(auVar45);
      auVar87 = ZEXT1632(auVar45);
      auVar72 = vpermps_avx512vl(auVar84,auVar87);
      auVar73 = vbroadcastss_avx512vl(auVar59);
      auVar82 = ZEXT1632(auVar59);
      auVar74 = vpermps_avx512vl(auVar84,auVar82);
      auVar75 = vbroadcastss_avx512vl(auVar58);
      auVar85 = ZEXT1632(auVar58);
      auVar76 = vpermps_avx512vl(auVar84,auVar85);
      auVar222._4_4_ = fVar239;
      auVar222._0_4_ = fVar239;
      auVar222._8_4_ = fVar239;
      auVar222._12_4_ = fVar239;
      auVar222._16_4_ = fVar239;
      auVar222._20_4_ = fVar239;
      auVar222._24_4_ = fVar239;
      auVar222._28_4_ = fVar239;
      auVar83._8_4_ = 2;
      auVar83._0_8_ = 0x200000002;
      auVar83._12_4_ = 2;
      auVar83._16_4_ = 2;
      auVar83._20_4_ = 2;
      auVar83._24_4_ = 2;
      auVar83._28_4_ = 2;
      auVar77 = vpermps_avx512vl(auVar83,auVar88);
      auVar78 = vbroadcastss_avx512vl(ZEXT416(3));
      auVar79 = vpermps_avx512vl(auVar78,auVar88);
      auVar80 = vpermps_avx512vl(auVar83,auVar87);
      auVar81 = vpermps_avx512vl(auVar78,auVar87);
      auVar88 = vpermps_avx2(auVar83,auVar82);
      auVar82 = vpermps_avx512vl(auVar78,auVar82);
      auVar83 = vpermps_avx512vl(auVar83,auVar85);
      auVar84 = vpermps_avx512vl(auVar78,auVar85);
      auVar56 = vfmadd132ps_fma(auVar89,auVar149,_DAT_01faff20);
      auVar89 = vsubps_avx(auVar262,ZEXT1632(auVar56));
      auVar78 = vmulps_avx512vl(auVar71,ZEXT1632(auVar56));
      auVar87 = ZEXT1632(auVar56);
      auVar85 = vmulps_avx512vl(auVar72,auVar87);
      auVar58 = vfmadd231ps_fma(auVar78,auVar89,auVar91);
      auVar59 = vfmadd231ps_fma(auVar85,auVar89,auVar86);
      auVar78 = vmulps_avx512vl(auVar73,auVar87);
      auVar85 = vmulps_avx512vl(auVar74,auVar87);
      auVar71 = vfmadd231ps_avx512vl(auVar78,auVar89,auVar71);
      auVar72 = vfmadd231ps_avx512vl(auVar85,auVar89,auVar72);
      auVar78 = vmulps_avx512vl(auVar75,auVar87);
      auVar91 = ZEXT1632(auVar56);
      auVar76 = vmulps_avx512vl(auVar76,auVar91);
      auVar73 = vfmadd231ps_avx512vl(auVar78,auVar89,auVar73);
      auVar74 = vfmadd231ps_avx512vl(auVar76,auVar89,auVar74);
      fVar234 = auVar56._0_4_;
      fVar235 = auVar56._4_4_;
      auVar76._4_4_ = fVar235 * auVar71._4_4_;
      auVar76._0_4_ = fVar234 * auVar71._0_4_;
      fVar236 = auVar56._8_4_;
      auVar76._8_4_ = fVar236 * auVar71._8_4_;
      fVar237 = auVar56._12_4_;
      auVar76._12_4_ = fVar237 * auVar71._12_4_;
      auVar76._16_4_ = auVar71._16_4_ * 0.0;
      auVar76._20_4_ = auVar71._20_4_ * 0.0;
      auVar76._24_4_ = auVar71._24_4_ * 0.0;
      auVar76._28_4_ = fVar224;
      auVar78._4_4_ = fVar235 * auVar72._4_4_;
      auVar78._0_4_ = fVar234 * auVar72._0_4_;
      auVar78._8_4_ = fVar236 * auVar72._8_4_;
      auVar78._12_4_ = fVar237 * auVar72._12_4_;
      auVar78._16_4_ = auVar72._16_4_ * 0.0;
      auVar78._20_4_ = auVar72._20_4_ * 0.0;
      auVar78._24_4_ = auVar72._24_4_ * 0.0;
      auVar78._28_4_ = auVar86._28_4_;
      auVar58 = vfmadd231ps_fma(auVar76,auVar89,ZEXT1632(auVar58));
      auVar59 = vfmadd231ps_fma(auVar78,auVar89,ZEXT1632(auVar59));
      auVar90._0_4_ = fVar234 * auVar73._0_4_;
      auVar90._4_4_ = fVar235 * auVar73._4_4_;
      auVar90._8_4_ = fVar236 * auVar73._8_4_;
      auVar90._12_4_ = fVar237 * auVar73._12_4_;
      auVar90._16_4_ = auVar73._16_4_ * 0.0;
      auVar90._20_4_ = auVar73._20_4_ * 0.0;
      auVar90._24_4_ = auVar73._24_4_ * 0.0;
      auVar90._28_4_ = 0;
      auVar85._4_4_ = fVar235 * auVar74._4_4_;
      auVar85._0_4_ = fVar234 * auVar74._0_4_;
      auVar85._8_4_ = fVar236 * auVar74._8_4_;
      auVar85._12_4_ = fVar237 * auVar74._12_4_;
      auVar85._16_4_ = auVar74._16_4_ * 0.0;
      auVar85._20_4_ = auVar74._20_4_ * 0.0;
      auVar85._24_4_ = auVar74._24_4_ * 0.0;
      auVar85._28_4_ = auVar73._28_4_;
      auVar60 = vfmadd231ps_fma(auVar90,auVar89,auVar71);
      auVar45 = vfmadd231ps_fma(auVar85,auVar89,auVar72);
      auVar87._28_4_ = auVar72._28_4_;
      auVar87._0_28_ =
           ZEXT1628(CONCAT412(fVar237 * auVar45._12_4_,
                              CONCAT48(fVar236 * auVar45._8_4_,
                                       CONCAT44(fVar235 * auVar45._4_4_,fVar234 * auVar45._0_4_))));
      auVar46 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar237 * auVar60._12_4_,
                                                   CONCAT48(fVar236 * auVar60._8_4_,
                                                            CONCAT44(fVar235 * auVar60._4_4_,
                                                                     fVar234 * auVar60._0_4_)))),
                                auVar89,ZEXT1632(auVar58));
      auVar47 = vfmadd231ps_fma(auVar87,auVar89,ZEXT1632(auVar59));
      auVar86 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar58));
      auVar71 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar59));
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar86 = vmulps_avx512vl(auVar86,auVar72);
      auVar71 = vmulps_avx512vl(auVar71,auVar72);
      auVar170._0_4_ = fVar239 * auVar86._0_4_;
      auVar170._4_4_ = fVar239 * auVar86._4_4_;
      auVar170._8_4_ = fVar239 * auVar86._8_4_;
      auVar170._12_4_ = fVar239 * auVar86._12_4_;
      auVar170._16_4_ = fVar239 * auVar86._16_4_;
      auVar170._20_4_ = fVar239 * auVar86._20_4_;
      auVar170._24_4_ = fVar239 * auVar86._24_4_;
      auVar170._28_4_ = 0;
      auVar86 = vmulps_avx512vl(auVar222,auVar71);
      auVar59 = vxorps_avx512vl(auVar75._0_16_,auVar75._0_16_);
      auVar71 = vpermt2ps_avx512vl(ZEXT1632(auVar46),_DAT_01feed00,ZEXT1632(auVar59));
      auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar47),_DAT_01feed00,ZEXT1632(auVar59));
      auVar129._0_4_ = auVar170._0_4_ + auVar46._0_4_;
      auVar129._4_4_ = auVar170._4_4_ + auVar46._4_4_;
      auVar129._8_4_ = auVar170._8_4_ + auVar46._8_4_;
      auVar129._12_4_ = auVar170._12_4_ + auVar46._12_4_;
      auVar129._16_4_ = auVar170._16_4_ + 0.0;
      auVar129._20_4_ = auVar170._20_4_ + 0.0;
      auVar129._24_4_ = auVar170._24_4_ + 0.0;
      auVar129._28_4_ = 0;
      auVar90 = ZEXT1632(auVar59);
      auVar74 = vpermt2ps_avx512vl(auVar170,_DAT_01feed00,auVar90);
      auVar75 = vaddps_avx512vl(ZEXT1632(auVar47),auVar86);
      auVar76 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,auVar90);
      auVar86 = vsubps_avx(auVar71,auVar74);
      auVar74 = vsubps_avx512vl(auVar73,auVar76);
      auVar76 = vmulps_avx512vl(auVar80,auVar91);
      auVar78 = vmulps_avx512vl(auVar81,auVar91);
      auVar76 = vfmadd231ps_avx512vl(auVar76,auVar89,auVar77);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar89,auVar79);
      auVar85 = vmulps_avx512vl(auVar88,auVar91);
      auVar87 = vmulps_avx512vl(auVar82,auVar91);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar89,auVar80);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,auVar81);
      auVar77 = vmulps_avx512vl(auVar83,auVar91);
      auVar79 = vmulps_avx512vl(auVar84,auVar91);
      auVar58 = vfmadd231ps_fma(auVar77,auVar89,auVar88);
      auVar88 = vfmadd231ps_avx512vl(auVar79,auVar89,auVar82);
      auVar77 = vmulps_avx512vl(auVar91,auVar85);
      auVar80 = ZEXT1632(auVar56);
      auVar79 = vmulps_avx512vl(auVar80,auVar87);
      auVar76 = vfmadd231ps_avx512vl(auVar77,auVar89,auVar76);
      auVar78 = vfmadd231ps_avx512vl(auVar79,auVar89,auVar78);
      auVar88 = vmulps_avx512vl(auVar80,auVar88);
      auVar85 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar237 * auVar58._12_4_,
                                              CONCAT48(fVar236 * auVar58._8_4_,
                                                       CONCAT44(fVar235 * auVar58._4_4_,
                                                                fVar234 * auVar58._0_4_)))),auVar89,
                           auVar85);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar89,auVar87);
      auVar77._4_4_ = fVar235 * auVar85._4_4_;
      auVar77._0_4_ = fVar234 * auVar85._0_4_;
      auVar77._8_4_ = fVar236 * auVar85._8_4_;
      auVar77._12_4_ = fVar237 * auVar85._12_4_;
      auVar77._16_4_ = auVar85._16_4_ * 0.0;
      auVar77._20_4_ = auVar85._20_4_ * 0.0;
      auVar77._24_4_ = auVar85._24_4_ * 0.0;
      auVar77._28_4_ = auVar82._28_4_;
      auVar87 = vmulps_avx512vl(auVar80,auVar88);
      auVar77 = vfmadd231ps_avx512vl(auVar77,auVar89,auVar76);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar78,auVar89);
      auVar89 = vsubps_avx512vl(auVar85,auVar76);
      auVar88 = vsubps_avx512vl(auVar88,auVar78);
      auVar89 = vmulps_avx512vl(auVar89,auVar72);
      auVar88 = vmulps_avx512vl(auVar88,auVar72);
      fVar224 = fVar239 * auVar89._0_4_;
      fVar234 = fVar239 * auVar89._4_4_;
      auVar79._4_4_ = fVar234;
      auVar79._0_4_ = fVar224;
      fVar235 = fVar239 * auVar89._8_4_;
      auVar79._8_4_ = fVar235;
      fVar236 = fVar239 * auVar89._12_4_;
      auVar79._12_4_ = fVar236;
      fVar237 = fVar239 * auVar89._16_4_;
      auVar79._16_4_ = fVar237;
      fVar238 = fVar239 * auVar89._20_4_;
      auVar79._20_4_ = fVar238;
      fVar239 = fVar239 * auVar89._24_4_;
      auVar79._24_4_ = fVar239;
      auVar79._28_4_ = auVar89._28_4_;
      auVar88 = vmulps_avx512vl(auVar222,auVar88);
      auVar72 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,auVar90);
      auVar76 = vpermt2ps_avx512vl(auVar87,_DAT_01feed00,auVar90);
      auVar223._0_4_ = auVar77._0_4_ + fVar224;
      auVar223._4_4_ = auVar77._4_4_ + fVar234;
      auVar223._8_4_ = auVar77._8_4_ + fVar235;
      auVar223._12_4_ = auVar77._12_4_ + fVar236;
      auVar223._16_4_ = auVar77._16_4_ + fVar237;
      auVar223._20_4_ = auVar77._20_4_ + fVar238;
      auVar223._24_4_ = auVar77._24_4_ + fVar239;
      auVar223._28_4_ = auVar77._28_4_ + auVar89._28_4_;
      auVar89 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,ZEXT1632(auVar59));
      auVar78 = vaddps_avx512vl(auVar87,auVar88);
      auVar88 = vpermt2ps_avx512vl(auVar88,_DAT_01feed00,ZEXT1632(auVar59));
      auVar89 = vsubps_avx(auVar72,auVar89);
      auVar88 = vsubps_avx512vl(auVar76,auVar88);
      auVar149 = ZEXT1632(auVar46);
      auVar85 = vsubps_avx512vl(auVar77,auVar149);
      auVar170 = ZEXT1632(auVar47);
      auVar79 = vsubps_avx512vl(auVar87,auVar170);
      auVar80 = vsubps_avx512vl(auVar72,auVar71);
      auVar85 = vaddps_avx512vl(auVar85,auVar80);
      auVar80 = vsubps_avx512vl(auVar76,auVar73);
      auVar79 = vaddps_avx512vl(auVar79,auVar80);
      auVar80 = vmulps_avx512vl(auVar170,auVar85);
      auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar149,auVar79);
      auVar81 = vmulps_avx512vl(auVar75,auVar85);
      auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar129,auVar79);
      auVar82 = vmulps_avx512vl(auVar74,auVar85);
      auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar86,auVar79);
      auVar83 = vmulps_avx512vl(auVar73,auVar85);
      auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar71,auVar79);
      auVar84 = vmulps_avx512vl(auVar87,auVar85);
      auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar77,auVar79);
      auVar90 = vmulps_avx512vl(auVar78,auVar85);
      auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar223,auVar79);
      auVar91 = vmulps_avx512vl(auVar88,auVar85);
      auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar89,auVar79);
      auVar85 = vmulps_avx512vl(auVar76,auVar85);
      auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar72,auVar79);
      auVar79 = vminps_avx512vl(auVar80,auVar81);
      auVar80 = vmaxps_avx512vl(auVar80,auVar81);
      auVar81 = vminps_avx512vl(auVar82,auVar83);
      auVar79 = vminps_avx512vl(auVar79,auVar81);
      auVar81 = vmaxps_avx512vl(auVar82,auVar83);
      auVar80 = vmaxps_avx512vl(auVar80,auVar81);
      auVar81 = vminps_avx512vl(auVar84,auVar90);
      auVar82 = vmaxps_avx512vl(auVar84,auVar90);
      auVar83 = vminps_avx512vl(auVar91,auVar85);
      auVar81 = vminps_avx512vl(auVar81,auVar83);
      auVar79 = vminps_avx512vl(auVar79,auVar81);
      auVar85 = vmaxps_avx512vl(auVar91,auVar85);
      auVar85 = vmaxps_avx512vl(auVar82,auVar85);
      auVar85 = vmaxps_avx512vl(auVar80,auVar85);
      uVar18 = vcmpps_avx512vl(auVar79,local_260,2);
      auVar80._4_4_ = uStack_1bc;
      auVar80._0_4_ = local_1c0;
      auVar80._8_4_ = uStack_1b8;
      auVar80._12_4_ = uStack_1b4;
      auVar80._16_4_ = uStack_1b0;
      auVar80._20_4_ = uStack_1ac;
      auVar80._24_4_ = uStack_1a8;
      auVar80._28_4_ = uStack_1a4;
      uVar19 = vcmpps_avx512vl(auVar85,auVar80,5);
      bVar27 = (byte)uVar18 & (byte)uVar19 & 0x7f;
      if (bVar27 == 0) {
        auVar42 = vxorps_avx512vl(auVar85._0_16_,auVar85._0_16_);
        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      }
      else {
        auVar85 = vsubps_avx512vl(auVar71,auVar149);
        auVar79 = vsubps_avx512vl(auVar73,auVar170);
        auVar81 = vsubps_avx512vl(auVar72,auVar77);
        auVar85 = vaddps_avx512vl(auVar85,auVar81);
        auVar81 = vsubps_avx512vl(auVar76,auVar87);
        auVar79 = vaddps_avx512vl(auVar79,auVar81);
        auVar81 = vmulps_avx512vl(auVar170,auVar85);
        auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar79,auVar149);
        auVar75 = vmulps_avx512vl(auVar75,auVar85);
        auVar75 = vfnmadd213ps_avx512vl(auVar129,auVar79,auVar75);
        auVar74 = vmulps_avx512vl(auVar74,auVar85);
        auVar74 = vfnmadd213ps_avx512vl(auVar86,auVar79,auVar74);
        auVar86 = vmulps_avx512vl(auVar73,auVar85);
        auVar73 = vfnmadd231ps_avx512vl(auVar86,auVar79,auVar71);
        auVar86 = vmulps_avx512vl(auVar87,auVar85);
        auVar87 = vfnmadd231ps_avx512vl(auVar86,auVar79,auVar77);
        auVar86 = vmulps_avx512vl(auVar78,auVar85);
        auVar78 = vfnmadd213ps_avx512vl(auVar223,auVar79,auVar86);
        auVar86 = vmulps_avx512vl(auVar88,auVar85);
        auVar77 = vfnmadd213ps_avx512vl(auVar89,auVar79,auVar86);
        auVar89 = vmulps_avx512vl(auVar76,auVar85);
        auVar76 = vfnmadd231ps_avx512vl(auVar89,auVar72,auVar79);
        auVar86 = vminps_avx(auVar81,auVar75);
        auVar89 = vmaxps_avx(auVar81,auVar75);
        auVar71 = vminps_avx(auVar74,auVar73);
        auVar71 = vminps_avx(auVar86,auVar71);
        auVar86 = vmaxps_avx(auVar74,auVar73);
        auVar89 = vmaxps_avx(auVar89,auVar86);
        auVar88 = vminps_avx(auVar87,auVar78);
        auVar86 = vmaxps_avx(auVar87,auVar78);
        auVar72 = vminps_avx(auVar77,auVar76);
        auVar88 = vminps_avx(auVar88,auVar72);
        auVar88 = vminps_avx(auVar71,auVar88);
        auVar71 = vmaxps_avx(auVar77,auVar76);
        auVar86 = vmaxps_avx(auVar86,auVar71);
        auVar89 = vmaxps_avx(auVar89,auVar86);
        uVar18 = vcmpps_avx512vl(auVar89,auVar80,5);
        uVar19 = vcmpps_avx512vl(auVar88,local_260,2);
        bVar27 = bVar27 & (byte)uVar18 & (byte)uVar19;
        auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        if (bVar27 != 0) {
          auStack_440[uVar29] = (uint)bVar27;
          uVar18 = vmovlps_avx(auVar42);
          (&uStack_240)[uVar29] = uVar18;
          uVar3 = vmovlps_avx(auVar121);
          auStack_1a0[uVar29] = uVar3;
          uVar29 = (ulong)((int)uVar29 + 1);
        }
        auVar42 = vxorps_avx512vl(auVar85._0_16_,auVar85._0_16_);
        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      }
      auVar277 = ZEXT1664(auVar58);
      in_ZMM24 = ZEXT3264(_DAT_01feed20);
      auVar273 = ZEXT1664(auVar56);
      auVar272 = ZEXT3264(auVar89);
      auVar271 = ZEXT1664(auVar42);
      if ((int)uVar29 != 0) {
        do {
          auVar56 = auVar271._0_16_;
          uVar28 = (int)uVar29 - 1;
          uVar30 = (ulong)uVar28;
          uVar7 = auStack_440[uVar30];
          auVar121._8_8_ = 0;
          auVar121._0_8_ = auStack_1a0[uVar30];
          uVar3 = 0;
          for (uVar34 = (ulong)uVar7; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
          {
            uVar3 = uVar3 + 1;
          }
          uVar32 = uVar7 - 1 & uVar7;
          bVar39 = uVar32 == 0;
          auStack_440[uVar30] = uVar32;
          if (bVar39) {
            uVar29 = (ulong)uVar28;
          }
          auVar109._8_8_ = 0;
          auVar109._0_8_ = uVar3;
          auVar42 = vpunpcklqdq_avx(auVar109,ZEXT416((int)uVar3 + 1));
          auVar42 = vcvtqq2ps_avx512vl(auVar42);
          auVar42 = vmulps_avx512vl(auVar42,auVar273._0_16_);
          uVar105 = *(undefined4 *)((long)&uStack_240 + uVar30 * 8 + 4);
          auVar21._4_4_ = uVar105;
          auVar21._0_4_ = uVar105;
          auVar21._8_4_ = uVar105;
          auVar21._12_4_ = uVar105;
          auVar58 = vmulps_avx512vl(auVar42,auVar21);
          auVar59 = auVar275._0_16_;
          auVar42 = vsubps_avx512vl(auVar59,auVar42);
          uVar105 = *(undefined4 *)(&uStack_240 + uVar30);
          auVar22._4_4_ = uVar105;
          auVar22._0_4_ = uVar105;
          auVar22._8_4_ = uVar105;
          auVar22._12_4_ = uVar105;
          auVar42 = vfmadd231ps_avx512vl(auVar58,auVar42,auVar22);
          auVar58 = vmovshdup_avx(auVar42);
          fVar239 = auVar58._0_4_ - auVar42._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar239));
          if (uVar7 == 0 || bVar39) goto LAB_01bcb8d5;
          auVar58 = vshufps_avx(auVar121,auVar121,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar239));
          uVar28 = (uint)uVar29;
          auVar46 = vsubps_avx512vl(auVar59,auVar58);
          fVar224 = auVar58._0_4_;
          auVar165._0_4_ = fVar224 * fVar144;
          fVar234 = auVar58._4_4_;
          auVar165._4_4_ = fVar234 * fVar152;
          fVar235 = auVar58._8_4_;
          auVar165._8_4_ = fVar235 * fVar144;
          fVar236 = auVar58._12_4_;
          auVar165._12_4_ = fVar236 * fVar152;
          auVar182._0_4_ = fVar224 * fVar130;
          auVar182._4_4_ = fVar234 * fVar141;
          auVar182._8_4_ = fVar235 * fVar130;
          auVar182._12_4_ = fVar236 * fVar141;
          auVar189._0_4_ = fVar224 * fVar142;
          auVar189._4_4_ = fVar234 * fVar143;
          auVar189._8_4_ = fVar235 * fVar142;
          auVar189._12_4_ = fVar236 * fVar143;
          auVar137._0_4_ = fVar224 * fVar240;
          auVar137._4_4_ = fVar234 * fVar249;
          auVar137._8_4_ = fVar235 * fVar240;
          auVar137._12_4_ = fVar236 * fVar249;
          auVar58 = vfmadd231ps_fma(auVar165,auVar46,auVar43);
          auVar60 = vfmadd231ps_fma(auVar182,auVar46,auVar54);
          auVar45 = vfmadd231ps_fma(auVar189,auVar46,auVar201);
          auVar46 = vfmadd231ps_fma(auVar137,auVar46,auVar210);
          auVar150._16_16_ = auVar58;
          auVar150._0_16_ = auVar58;
          auVar171._16_16_ = auVar60;
          auVar171._0_16_ = auVar60;
          auVar186._16_16_ = auVar45;
          auVar186._0_16_ = auVar45;
          auVar86 = vpermps_avx512vl(in_ZMM24._0_32_,ZEXT1632(auVar42));
          auVar89 = vsubps_avx(auVar171,auVar150);
          auVar60 = vfmadd213ps_fma(auVar89,auVar86,auVar150);
          auVar89 = vsubps_avx(auVar186,auVar171);
          auVar47 = vfmadd213ps_fma(auVar89,auVar86,auVar171);
          auVar58 = vsubps_avx(auVar46,auVar45);
          auVar172._16_16_ = auVar58;
          auVar172._0_16_ = auVar58;
          auVar58 = vfmadd213ps_fma(auVar172,auVar86,auVar186);
          auVar89 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar60));
          auVar60 = vfmadd213ps_fma(auVar89,auVar86,ZEXT1632(auVar60));
          auVar89 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar47));
          auVar58 = vfmadd213ps_fma(auVar89,auVar86,ZEXT1632(auVar47));
          auVar89 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar60));
          auVar70 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar89,auVar86);
          auVar89 = vmulps_avx512vl(auVar89,auVar272._0_32_);
          auVar82._16_16_ = auVar89._16_16_;
          auVar58 = vmulss_avx512f(ZEXT416((uint)fVar239),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar224 = auVar58._0_4_;
          auVar190._0_8_ =
               CONCAT44(auVar70._4_4_ + fVar224 * auVar89._4_4_,
                        auVar70._0_4_ + fVar224 * auVar89._0_4_);
          auVar190._8_4_ = auVar70._8_4_ + fVar224 * auVar89._8_4_;
          auVar190._12_4_ = auVar70._12_4_ + fVar224 * auVar89._12_4_;
          auVar166._0_4_ = fVar224 * auVar89._16_4_;
          auVar166._4_4_ = fVar224 * auVar89._20_4_;
          auVar166._8_4_ = fVar224 * auVar89._24_4_;
          auVar166._12_4_ = fVar224 * auVar89._28_4_;
          auVar52 = vsubps_avx((undefined1  [16])0x0,auVar166);
          auVar47 = vshufpd_avx(auVar70,auVar70,3);
          auVar48 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar58 = vsubps_avx(auVar47,auVar70);
          auVar60 = vsubps_avx(auVar48,(undefined1  [16])0x0);
          auVar211._0_4_ = auVar58._0_4_ + auVar60._0_4_;
          auVar211._4_4_ = auVar58._4_4_ + auVar60._4_4_;
          auVar211._8_4_ = auVar58._8_4_ + auVar60._8_4_;
          auVar211._12_4_ = auVar58._12_4_ + auVar60._12_4_;
          auVar58 = vshufps_avx(auVar70,auVar70,0xb1);
          auVar60 = vshufps_avx(auVar190,auVar190,0xb1);
          auVar45 = vshufps_avx(auVar52,auVar52,0xb1);
          auVar46 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar260._4_4_ = auVar211._0_4_;
          auVar260._0_4_ = auVar211._0_4_;
          auVar260._8_4_ = auVar211._0_4_;
          auVar260._12_4_ = auVar211._0_4_;
          auVar49 = vshufps_avx(auVar211,auVar211,0x55);
          fVar224 = auVar49._0_4_;
          auVar220._0_4_ = auVar58._0_4_ * fVar224;
          fVar234 = auVar49._4_4_;
          auVar220._4_4_ = auVar58._4_4_ * fVar234;
          fVar235 = auVar49._8_4_;
          auVar220._8_4_ = auVar58._8_4_ * fVar235;
          fVar236 = auVar49._12_4_;
          auVar220._12_4_ = auVar58._12_4_ * fVar236;
          auVar226._0_4_ = auVar60._0_4_ * fVar224;
          auVar226._4_4_ = auVar60._4_4_ * fVar234;
          auVar226._8_4_ = auVar60._8_4_ * fVar235;
          auVar226._12_4_ = auVar60._12_4_ * fVar236;
          auVar243._0_4_ = auVar45._0_4_ * fVar224;
          auVar243._4_4_ = auVar45._4_4_ * fVar234;
          auVar243._8_4_ = auVar45._8_4_ * fVar235;
          auVar243._12_4_ = auVar45._12_4_ * fVar236;
          auVar212._0_4_ = auVar46._0_4_ * fVar224;
          auVar212._4_4_ = auVar46._4_4_ * fVar234;
          auVar212._8_4_ = auVar46._8_4_ * fVar235;
          auVar212._12_4_ = auVar46._12_4_ * fVar236;
          auVar58 = vfmadd231ps_fma(auVar220,auVar260,auVar70);
          auVar60 = vfmadd231ps_fma(auVar226,auVar260,auVar190);
          auVar53 = vfmadd231ps_fma(auVar243,auVar260,auVar52);
          auVar66 = vfmadd231ps_fma(auVar212,(undefined1  [16])0x0,auVar260);
          auVar49 = vshufpd_avx(auVar58,auVar58,1);
          auVar50 = vshufpd_avx(auVar60,auVar60,1);
          auVar64 = vshufpd_avx512vl(auVar53,auVar53,1);
          auVar65 = vshufpd_avx512vl(auVar66,auVar66,1);
          auVar45 = vminss_avx(auVar58,auVar60);
          auVar58 = vmaxss_avx(auVar60,auVar58);
          auVar46 = vminss_avx(auVar53,auVar66);
          auVar60 = vmaxss_avx(auVar66,auVar53);
          auVar45 = vminss_avx(auVar45,auVar46);
          auVar58 = vmaxss_avx(auVar60,auVar58);
          auVar46 = vminss_avx(auVar49,auVar50);
          auVar60 = vmaxss_avx(auVar50,auVar49);
          auVar49 = vminss_avx512f(auVar64,auVar65);
          auVar50 = vmaxss_avx512f(auVar65,auVar64);
          auVar60 = vmaxss_avx(auVar50,auVar60);
          auVar46 = vminss_avx512f(auVar46,auVar49);
          vucomiss_avx512f(auVar45);
          fVar234 = auVar60._0_4_;
          fVar224 = auVar58._0_4_;
          if (uVar28 < 5) {
LAB_01bcc06a:
            auVar49 = vucomiss_avx512f(auVar46);
            bVar40 = fVar234 <= -0.0001;
            bVar38 = -0.0001 < fVar224;
            bVar37 = bVar40;
            if (!bVar40) goto LAB_01bcc0b0;
            uVar18 = vcmpps_avx512vl(auVar45,auVar49,5);
            uVar19 = vcmpps_avx512vl(auVar46,auVar49,5);
            bVar27 = (byte)uVar18 & (byte)uVar19 & 1;
            bVar40 = bVar38 && bVar27 == 0;
            bVar37 = bVar38 && bVar27 == 0;
            if (bVar38 && bVar27 == 0) goto LAB_01bcc0b0;
          }
          else {
            bVar40 = fVar234 == -0.0001;
            bVar37 = NAN(fVar234);
            if (fVar234 <= -0.0001) goto LAB_01bcc06a;
LAB_01bcc0b0:
            vcmpss_avx512f(auVar45,auVar56,1);
            auVar53 = auVar276._0_16_;
            uVar18 = vcmpss_avx512f(auVar58,auVar56,1);
            bVar38 = (bool)((byte)uVar18 & 1);
            auVar82._0_16_ = auVar53;
            iVar103 = auVar276._0_4_;
            auVar92._4_28_ = auVar82._4_28_;
            auVar92._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * iVar103);
            vucomiss_avx512f(auVar92._0_16_);
            bVar37 = (bool)(!bVar40 | bVar37);
            bVar38 = bVar37 == false;
            auVar94._16_16_ = auVar82._16_16_;
            auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar93._4_28_ = auVar94._4_28_;
            auVar93._0_4_ = (uint)bVar37 * auVar271._0_4_ + (uint)!bVar37 * 0x7f800000;
            auVar50 = auVar93._0_16_;
            auVar96._16_16_ = auVar82._16_16_;
            auVar96._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar95._4_28_ = auVar96._4_28_;
            auVar95._0_4_ = (uint)bVar37 * auVar271._0_4_ + (uint)!bVar37 * -0x800000;
            auVar49 = auVar95._0_16_;
            uVar18 = vcmpss_avx512f(auVar46,auVar56,1);
            bVar40 = (bool)((byte)uVar18 & 1);
            auVar98._16_16_ = auVar82._16_16_;
            auVar98._0_16_ = auVar53;
            auVar97._4_28_ = auVar98._4_28_;
            auVar97._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * iVar103);
            vucomiss_avx512f(auVar97._0_16_);
            if ((bVar37) || (bVar38)) {
              auVar46 = vucomiss_avx512f(auVar45);
              if ((bVar37) || (bVar38)) {
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar66 = vxorps_avx512vl(auVar45,auVar26);
                auVar45 = vsubss_avx512f(auVar46,auVar45);
                auVar45 = vdivss_avx512f(auVar66,auVar45);
                auVar46 = vsubss_avx512f(auVar53,auVar45);
                auVar45 = vfmadd213ss_avx512f(auVar46,auVar56,auVar45);
                auVar46 = auVar45;
              }
              else {
                auVar46 = vxorps_avx512vl(auVar46,auVar46);
                vucomiss_avx512f(auVar46);
                if ((bVar37) || (auVar45 = auVar53, bVar38)) {
                  auVar45 = SUB6416(ZEXT464(0xff800000),0);
                  auVar46 = ZEXT416(0x7f800000);
                }
              }
              auVar50 = vminss_avx512f(auVar50,auVar46);
              auVar49 = vmaxss_avx(auVar45,auVar49);
            }
            uVar18 = vcmpss_avx512f(auVar60,auVar56,1);
            bVar40 = (bool)((byte)uVar18 & 1);
            fVar235 = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * iVar103);
            if ((auVar92._0_4_ != fVar235) || (NAN(auVar92._0_4_) || NAN(fVar235))) {
              if ((fVar234 != fVar224) || (NAN(fVar234) || NAN(fVar224))) {
                auVar25._8_4_ = 0x80000000;
                auVar25._0_8_ = 0x8000000080000000;
                auVar25._12_4_ = 0x80000000;
                auVar58 = vxorps_avx512vl(auVar58,auVar25);
                auVar213._0_4_ = auVar58._0_4_ / (fVar234 - fVar224);
                auVar213._4_12_ = auVar58._4_12_;
                auVar58 = vsubss_avx512f(auVar53,auVar213);
                auVar58 = vfmadd213ss_avx512f(auVar58,auVar56,auVar213);
                auVar60 = auVar58;
              }
              else if ((fVar224 != 0.0) ||
                      (auVar58 = auVar53, auVar60 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar224))) {
                auVar58 = SUB6416(ZEXT464(0xff800000),0);
                auVar60 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar50 = vminss_avx(auVar50,auVar60);
              auVar49 = vmaxss_avx(auVar58,auVar49);
            }
            bVar40 = auVar97._0_4_ != fVar235;
            auVar58 = vminss_avx512f(auVar50,auVar53);
            auVar100._16_16_ = auVar82._16_16_;
            auVar100._0_16_ = auVar50;
            auVar99._4_28_ = auVar100._4_28_;
            auVar99._0_4_ = (uint)bVar40 * auVar58._0_4_ + (uint)!bVar40 * auVar50._0_4_;
            auVar58 = vmaxss_avx512f(auVar53,auVar49);
            auVar102._16_16_ = auVar82._16_16_;
            auVar102._0_16_ = auVar49;
            auVar101._4_28_ = auVar102._4_28_;
            auVar101._0_4_ = (uint)bVar40 * auVar58._0_4_ + (uint)!bVar40 * auVar49._0_4_;
            auVar58 = vmaxss_avx512f(auVar56,auVar99._0_16_);
            auVar60 = vminss_avx512f(auVar101._0_16_,auVar53);
            if (auVar58._0_4_ <= auVar60._0_4_) {
              auVar46 = vmaxss_avx512f(auVar56,ZEXT416((uint)(auVar58._0_4_ + -0.1)));
              auVar66 = vminss_avx512f(ZEXT416((uint)(auVar60._0_4_ + 0.1)),auVar53);
              auVar138._0_8_ = auVar70._0_8_;
              auVar138._8_8_ = auVar138._0_8_;
              auVar227._8_8_ = auVar190._0_8_;
              auVar227._0_8_ = auVar190._0_8_;
              auVar244._8_8_ = auVar52._0_8_;
              auVar244._0_8_ = auVar52._0_8_;
              auVar58 = vshufpd_avx(auVar190,auVar190,3);
              auVar60 = vshufpd_avx(auVar52,auVar52,3);
              auVar45 = vshufps_avx(auVar46,auVar66,0);
              auVar50 = vsubps_avx512vl(auVar59,auVar45);
              fVar224 = auVar45._0_4_;
              auVar183._0_4_ = fVar224 * auVar47._0_4_;
              fVar234 = auVar45._4_4_;
              auVar183._4_4_ = fVar234 * auVar47._4_4_;
              fVar235 = auVar45._8_4_;
              auVar183._8_4_ = fVar235 * auVar47._8_4_;
              fVar236 = auVar45._12_4_;
              auVar183._12_4_ = fVar236 * auVar47._12_4_;
              auVar191._0_4_ = fVar224 * auVar58._0_4_;
              auVar191._4_4_ = fVar234 * auVar58._4_4_;
              auVar191._8_4_ = fVar235 * auVar58._8_4_;
              auVar191._12_4_ = fVar236 * auVar58._12_4_;
              auVar266._0_4_ = auVar60._0_4_ * fVar224;
              auVar266._4_4_ = auVar60._4_4_ * fVar234;
              auVar266._8_4_ = auVar60._8_4_ * fVar235;
              auVar266._12_4_ = auVar60._12_4_ * fVar236;
              auVar167._0_4_ = fVar224 * auVar48._0_4_;
              auVar167._4_4_ = fVar234 * auVar48._4_4_;
              auVar167._8_4_ = fVar235 * auVar48._8_4_;
              auVar167._12_4_ = fVar236 * auVar48._12_4_;
              auVar47 = vfmadd231ps_fma(auVar183,auVar50,auVar138);
              auVar48 = vfmadd231ps_fma(auVar191,auVar50,auVar227);
              auVar49 = vfmadd231ps_fma(auVar266,auVar50,auVar244);
              auVar50 = vfmadd231ps_fma(auVar167,auVar50,ZEXT816(0));
              auVar60 = vsubss_avx512f(auVar53,auVar46);
              auVar58 = vmovshdup_avx(auVar121);
              auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * auVar46._0_4_)),auVar121,
                                        auVar60);
              auVar60 = vsubss_avx512f(auVar53,auVar66);
              auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * auVar66._0_4_)),auVar121,
                                        auVar60);
              auVar52 = vdivss_avx512f(auVar53,ZEXT416((uint)fVar239));
              auVar58 = vsubps_avx(auVar48,auVar47);
              auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar45 = vmulps_avx512vl(auVar58,auVar66);
              auVar58 = vsubps_avx(auVar49,auVar48);
              auVar46 = vmulps_avx512vl(auVar58,auVar66);
              auVar58 = vsubps_avx(auVar50,auVar49);
              auVar58 = vmulps_avx512vl(auVar58,auVar66);
              auVar60 = vminps_avx(auVar46,auVar58);
              auVar58 = vmaxps_avx(auVar46,auVar58);
              auVar60 = vminps_avx(auVar45,auVar60);
              auVar58 = vmaxps_avx(auVar45,auVar58);
              auVar45 = vshufpd_avx(auVar60,auVar60,3);
              auVar46 = vshufpd_avx(auVar58,auVar58,3);
              auVar60 = vminps_avx(auVar60,auVar45);
              auVar58 = vmaxps_avx(auVar58,auVar46);
              fVar239 = auVar52._0_4_;
              auVar214._0_4_ = auVar60._0_4_ * fVar239;
              auVar214._4_4_ = auVar60._4_4_ * fVar239;
              auVar214._8_4_ = auVar60._8_4_ * fVar239;
              auVar214._12_4_ = auVar60._12_4_ * fVar239;
              auVar202._0_4_ = fVar239 * auVar58._0_4_;
              auVar202._4_4_ = fVar239 * auVar58._4_4_;
              auVar202._8_4_ = fVar239 * auVar58._8_4_;
              auVar202._12_4_ = fVar239 * auVar58._12_4_;
              auVar52 = vdivss_avx512f(auVar53,ZEXT416((uint)(auVar65._0_4_ - auVar64._0_4_)));
              auVar58 = vshufpd_avx(auVar47,auVar47,3);
              auVar60 = vshufpd_avx(auVar48,auVar48,3);
              auVar45 = vshufpd_avx(auVar49,auVar49,3);
              auVar46 = vshufpd_avx(auVar50,auVar50,3);
              auVar58 = vsubps_avx(auVar58,auVar47);
              auVar47 = vsubps_avx(auVar60,auVar48);
              auVar48 = vsubps_avx(auVar45,auVar49);
              auVar46 = vsubps_avx(auVar46,auVar50);
              auVar60 = vminps_avx(auVar58,auVar47);
              auVar58 = vmaxps_avx(auVar58,auVar47);
              auVar45 = vminps_avx(auVar48,auVar46);
              auVar45 = vminps_avx(auVar60,auVar45);
              auVar60 = vmaxps_avx(auVar48,auVar46);
              auVar58 = vmaxps_avx(auVar58,auVar60);
              fVar239 = auVar52._0_4_;
              auVar245._0_4_ = fVar239 * auVar45._0_4_;
              auVar245._4_4_ = fVar239 * auVar45._4_4_;
              auVar245._8_4_ = fVar239 * auVar45._8_4_;
              auVar245._12_4_ = fVar239 * auVar45._12_4_;
              auVar228._0_4_ = fVar239 * auVar58._0_4_;
              auVar228._4_4_ = fVar239 * auVar58._4_4_;
              auVar228._8_4_ = fVar239 * auVar58._8_4_;
              auVar228._12_4_ = fVar239 * auVar58._12_4_;
              auVar46 = vinsertps_avx(auVar42,auVar64,0x10);
              auVar67 = vpermt2ps_avx512vl(auVar42,_DAT_01feecd0,auVar65);
              auVar122._0_4_ = auVar46._0_4_ + auVar67._0_4_;
              auVar122._4_4_ = auVar46._4_4_ + auVar67._4_4_;
              auVar122._8_4_ = auVar46._8_4_ + auVar67._8_4_;
              auVar122._12_4_ = auVar46._12_4_ + auVar67._12_4_;
              auVar52 = vmulps_avx512vl(auVar122,auVar277._0_16_);
              auVar60 = vshufps_avx(auVar52,auVar52,0x54);
              uVar105 = auVar52._0_4_;
              auVar125._4_4_ = uVar105;
              auVar125._0_4_ = uVar105;
              auVar125._8_4_ = uVar105;
              auVar125._12_4_ = uVar105;
              auVar48 = vfmadd213ps_avx512vl(local_270,auVar125,auVar44);
              auVar45 = vfmadd213ps_fma(local_280,auVar125,auVar51);
              auVar47 = vfmadd213ps_fma(local_290,auVar125,auVar57);
              auVar58 = vsubps_avx(auVar45,auVar48);
              auVar48 = vfmadd213ps_fma(auVar58,auVar125,auVar48);
              auVar58 = vsubps_avx(auVar47,auVar45);
              auVar58 = vfmadd213ps_fma(auVar58,auVar125,auVar45);
              auVar58 = vsubps_avx(auVar58,auVar48);
              auVar45 = vfmadd231ps_fma(auVar48,auVar58,auVar125);
              auVar49 = vmulps_avx512vl(auVar58,auVar66);
              auVar253._8_8_ = auVar45._0_8_;
              auVar253._0_8_ = auVar45._0_8_;
              auVar58 = vshufpd_avx(auVar45,auVar45,3);
              auVar45 = vshufps_avx(auVar52,auVar52,0x55);
              auVar47 = vsubps_avx(auVar58,auVar253);
              auVar48 = vfmadd231ps_fma(auVar253,auVar45,auVar47);
              auVar267._8_8_ = auVar49._0_8_;
              auVar267._0_8_ = auVar49._0_8_;
              auVar58 = vshufpd_avx(auVar49,auVar49,3);
              auVar58 = vsubps_avx512vl(auVar58,auVar267);
              auVar58 = vfmadd213ps_avx512vl(auVar58,auVar45,auVar267);
              auVar126._0_8_ = auVar47._0_8_ ^ 0x8000000080000000;
              auVar126._8_4_ = auVar47._8_4_ ^ 0x80000000;
              auVar126._12_4_ = auVar47._12_4_ ^ 0x80000000;
              auVar45 = vmovshdup_avx512vl(auVar58);
              auVar268._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
              auVar268._8_4_ = auVar45._8_4_ ^ 0x80000000;
              auVar268._12_4_ = auVar45._12_4_ ^ 0x80000000;
              auVar49 = vmovshdup_avx512vl(auVar47);
              auVar50 = vpermt2ps_avx512vl(auVar268,ZEXT416(5),auVar47);
              auVar45 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar45._0_4_ * auVar47._0_4_)),auVar58,
                                            auVar49);
              auVar47 = vpermt2ps_avx512vl(auVar58,SUB6416(ZEXT464(4),0),auVar126);
              auVar168._0_4_ = auVar45._0_4_;
              auVar168._4_4_ = auVar168._0_4_;
              auVar168._8_4_ = auVar168._0_4_;
              auVar168._12_4_ = auVar168._0_4_;
              auVar58 = vdivps_avx(auVar50,auVar168);
              auVar68 = vdivps_avx512vl(auVar47,auVar168);
              fVar239 = auVar48._0_4_;
              auVar45 = vshufps_avx(auVar48,auVar48,0x55);
              auVar254._0_4_ = fVar239 * auVar58._0_4_ + auVar45._0_4_ * auVar68._0_4_;
              auVar254._4_4_ = fVar239 * auVar58._4_4_ + auVar45._4_4_ * auVar68._4_4_;
              auVar254._8_4_ = fVar239 * auVar58._8_4_ + auVar45._8_4_ * auVar68._8_4_;
              auVar254._12_4_ = fVar239 * auVar58._12_4_ + auVar45._12_4_ * auVar68._12_4_;
              auVar66 = vsubps_avx(auVar60,auVar254);
              auVar45 = vmovshdup_avx(auVar58);
              auVar60 = vinsertps_avx(auVar214,auVar245,0x1c);
              auVar269._0_4_ = auVar45._0_4_ * auVar60._0_4_;
              auVar269._4_4_ = auVar45._4_4_ * auVar60._4_4_;
              auVar269._8_4_ = auVar45._8_4_ * auVar60._8_4_;
              auVar269._12_4_ = auVar45._12_4_ * auVar60._12_4_;
              auVar70 = vinsertps_avx512f(auVar202,auVar228,0x1c);
              auVar45 = vmulps_avx512vl(auVar45,auVar70);
              auVar50 = vminps_avx512vl(auVar269,auVar45);
              auVar48 = vmaxps_avx(auVar45,auVar269);
              auVar49 = vmovshdup_avx(auVar68);
              auVar45 = vinsertps_avx(auVar245,auVar214,0x4c);
              auVar246._0_4_ = auVar49._0_4_ * auVar45._0_4_;
              auVar246._4_4_ = auVar49._4_4_ * auVar45._4_4_;
              auVar246._8_4_ = auVar49._8_4_ * auVar45._8_4_;
              auVar246._12_4_ = auVar49._12_4_ * auVar45._12_4_;
              auVar47 = vinsertps_avx(auVar228,auVar202,0x4c);
              auVar229._0_4_ = auVar49._0_4_ * auVar47._0_4_;
              auVar229._4_4_ = auVar49._4_4_ * auVar47._4_4_;
              auVar229._8_4_ = auVar49._8_4_ * auVar47._8_4_;
              auVar229._12_4_ = auVar49._12_4_ * auVar47._12_4_;
              auVar49 = vminps_avx(auVar246,auVar229);
              auVar50 = vaddps_avx512vl(auVar50,auVar49);
              auVar49 = vmaxps_avx(auVar229,auVar246);
              auVar230._0_4_ = auVar48._0_4_ + auVar49._0_4_;
              auVar230._4_4_ = auVar48._4_4_ + auVar49._4_4_;
              auVar230._8_4_ = auVar48._8_4_ + auVar49._8_4_;
              auVar230._12_4_ = auVar48._12_4_ + auVar49._12_4_;
              auVar247._8_8_ = 0x3f80000000000000;
              auVar247._0_8_ = 0x3f80000000000000;
              auVar48 = vsubps_avx(auVar247,auVar230);
              auVar49 = vsubps_avx(auVar247,auVar50);
              auVar50 = vsubps_avx(auVar46,auVar52);
              auVar52 = vsubps_avx(auVar67,auVar52);
              fVar236 = auVar50._0_4_;
              auVar270._0_4_ = fVar236 * auVar48._0_4_;
              fVar237 = auVar50._4_4_;
              auVar270._4_4_ = fVar237 * auVar48._4_4_;
              fVar238 = auVar50._8_4_;
              auVar270._8_4_ = fVar238 * auVar48._8_4_;
              fVar195 = auVar50._12_4_;
              auVar270._12_4_ = fVar195 * auVar48._12_4_;
              auVar69 = vbroadcastss_avx512vl(auVar58);
              auVar60 = vmulps_avx512vl(auVar69,auVar60);
              auVar70 = vmulps_avx512vl(auVar69,auVar70);
              auVar69 = vminps_avx512vl(auVar60,auVar70);
              auVar70 = vmaxps_avx512vl(auVar70,auVar60);
              auVar60 = vbroadcastss_avx512vl(auVar68);
              auVar45 = vmulps_avx512vl(auVar60,auVar45);
              auVar60 = vmulps_avx512vl(auVar60,auVar47);
              auVar47 = vminps_avx512vl(auVar45,auVar60);
              auVar47 = vaddps_avx512vl(auVar69,auVar47);
              auVar50 = vmulps_avx512vl(auVar50,auVar49);
              fVar239 = auVar52._0_4_;
              auVar231._0_4_ = fVar239 * auVar48._0_4_;
              fVar224 = auVar52._4_4_;
              auVar231._4_4_ = fVar224 * auVar48._4_4_;
              fVar234 = auVar52._8_4_;
              auVar231._8_4_ = fVar234 * auVar48._8_4_;
              fVar235 = auVar52._12_4_;
              auVar231._12_4_ = fVar235 * auVar48._12_4_;
              auVar248._0_4_ = fVar239 * auVar49._0_4_;
              auVar248._4_4_ = fVar224 * auVar49._4_4_;
              auVar248._8_4_ = fVar234 * auVar49._8_4_;
              auVar248._12_4_ = fVar235 * auVar49._12_4_;
              auVar60 = vmaxps_avx(auVar60,auVar45);
              auVar203._0_4_ = auVar70._0_4_ + auVar60._0_4_;
              auVar203._4_4_ = auVar70._4_4_ + auVar60._4_4_;
              auVar203._8_4_ = auVar70._8_4_ + auVar60._8_4_;
              auVar203._12_4_ = auVar70._12_4_ + auVar60._12_4_;
              auVar215._8_8_ = 0x3f800000;
              auVar215._0_8_ = 0x3f800000;
              auVar60 = vsubps_avx(auVar215,auVar203);
              auVar45 = vsubps_avx512vl(auVar215,auVar47);
              auVar261._0_4_ = fVar236 * auVar60._0_4_;
              auVar261._4_4_ = fVar237 * auVar60._4_4_;
              auVar261._8_4_ = fVar238 * auVar60._8_4_;
              auVar261._12_4_ = fVar195 * auVar60._12_4_;
              auVar255._0_4_ = fVar236 * auVar45._0_4_;
              auVar255._4_4_ = fVar237 * auVar45._4_4_;
              auVar255._8_4_ = fVar238 * auVar45._8_4_;
              auVar255._12_4_ = fVar195 * auVar45._12_4_;
              auVar204._0_4_ = fVar239 * auVar60._0_4_;
              auVar204._4_4_ = fVar224 * auVar60._4_4_;
              auVar204._8_4_ = fVar234 * auVar60._8_4_;
              auVar204._12_4_ = fVar235 * auVar60._12_4_;
              auVar216._0_4_ = fVar239 * auVar45._0_4_;
              auVar216._4_4_ = fVar224 * auVar45._4_4_;
              auVar216._8_4_ = fVar234 * auVar45._8_4_;
              auVar216._12_4_ = fVar235 * auVar45._12_4_;
              auVar60 = vminps_avx(auVar261,auVar255);
              auVar45 = vminps_avx512vl(auVar204,auVar216);
              auVar47 = vminps_avx512vl(auVar60,auVar45);
              auVar60 = vmaxps_avx(auVar255,auVar261);
              auVar45 = vmaxps_avx(auVar216,auVar204);
              auVar45 = vmaxps_avx(auVar45,auVar60);
              auVar48 = vminps_avx512vl(auVar270,auVar50);
              auVar60 = vminps_avx(auVar231,auVar248);
              auVar60 = vminps_avx(auVar48,auVar60);
              auVar60 = vhaddps_avx(auVar47,auVar60);
              auVar48 = vmaxps_avx512vl(auVar50,auVar270);
              auVar47 = vmaxps_avx(auVar248,auVar231);
              auVar47 = vmaxps_avx(auVar47,auVar48);
              auVar45 = vhaddps_avx(auVar45,auVar47);
              auVar60 = vshufps_avx(auVar60,auVar60,0xe8);
              auVar45 = vshufps_avx(auVar45,auVar45,0xe8);
              auVar205._0_4_ = auVar60._0_4_ + auVar66._0_4_;
              auVar205._4_4_ = auVar60._4_4_ + auVar66._4_4_;
              auVar205._8_4_ = auVar60._8_4_ + auVar66._8_4_;
              auVar205._12_4_ = auVar60._12_4_ + auVar66._12_4_;
              auVar217._0_4_ = auVar45._0_4_ + auVar66._0_4_;
              auVar217._4_4_ = auVar45._4_4_ + auVar66._4_4_;
              auVar217._8_4_ = auVar45._8_4_ + auVar66._8_4_;
              auVar217._12_4_ = auVar45._12_4_ + auVar66._12_4_;
              auVar60 = vmaxps_avx(auVar46,auVar205);
              auVar45 = vminps_avx(auVar217,auVar67);
              uVar3 = vcmpps_avx512vl(auVar45,auVar60,1);
              if ((uVar3 & 3) == 0) {
                uVar3 = vcmpps_avx512vl(auVar217,auVar67,1);
                uVar18 = vcmpps_avx512vl(auVar42,auVar205,1);
                if (((ushort)uVar18 & (ushort)uVar3 & 1) == 0) {
                  bVar27 = 0;
                }
                else {
                  auVar60 = vmovshdup_avx(auVar205);
                  bVar27 = auVar64._0_4_ < auVar60._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
                }
                local_450 = auVar55._0_4_;
                fStack_44c = auVar55._4_4_;
                fStack_448 = auVar55._8_4_;
                fStack_444 = auVar55._12_4_;
                if (((3 < uVar28 || uVar7 != 0 && !bVar39) | bVar27) != 1) {
                  auVar121 = vinsertps_avx(auVar64,auVar65,0x10);
                  goto LAB_01bcb8d5;
                }
                lVar31 = 200;
                do {
                  auVar42 = vsubss_avx512f(auVar53,auVar66);
                  fVar234 = auVar42._0_4_;
                  fVar239 = fVar234 * fVar234 * fVar234;
                  fVar235 = auVar66._0_4_;
                  fVar224 = fVar235 * 3.0 * fVar234 * fVar234;
                  fVar234 = fVar234 * fVar235 * fVar235 * 3.0;
                  auVar147._4_4_ = fVar239;
                  auVar147._0_4_ = fVar239;
                  auVar147._8_4_ = fVar239;
                  auVar147._12_4_ = fVar239;
                  auVar139._4_4_ = fVar224;
                  auVar139._0_4_ = fVar224;
                  auVar139._8_4_ = fVar224;
                  auVar139._12_4_ = fVar224;
                  auVar110._4_4_ = fVar234;
                  auVar110._0_4_ = fVar234;
                  auVar110._8_4_ = fVar234;
                  auVar110._12_4_ = fVar234;
                  fVar235 = fVar235 * fVar235 * fVar235;
                  auVar184._0_4_ = local_450 * fVar235;
                  auVar184._4_4_ = fStack_44c * fVar235;
                  auVar184._8_4_ = fStack_448 * fVar235;
                  auVar184._12_4_ = fStack_444 * fVar235;
                  auVar42 = vfmadd231ps_fma(auVar184,auVar57,auVar110);
                  auVar42 = vfmadd231ps_fma(auVar42,auVar51,auVar139);
                  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar44,auVar147);
                  auVar111._8_8_ = auVar42._0_8_;
                  auVar111._0_8_ = auVar42._0_8_;
                  auVar42 = vshufpd_avx(auVar42,auVar42,3);
                  auVar60 = vshufps_avx(auVar66,auVar66,0x55);
                  auVar42 = vsubps_avx(auVar42,auVar111);
                  auVar60 = vfmadd213ps_fma(auVar42,auVar60,auVar111);
                  fVar239 = auVar60._0_4_;
                  auVar42 = vshufps_avx(auVar60,auVar60,0x55);
                  auVar112._0_4_ = auVar58._0_4_ * fVar239 + auVar68._0_4_ * auVar42._0_4_;
                  auVar112._4_4_ = auVar58._4_4_ * fVar239 + auVar68._4_4_ * auVar42._4_4_;
                  auVar112._8_4_ = auVar58._8_4_ * fVar239 + auVar68._8_4_ * auVar42._8_4_;
                  auVar112._12_4_ = auVar58._12_4_ * fVar239 + auVar68._12_4_ * auVar42._12_4_;
                  auVar66 = vsubps_avx(auVar66,auVar112);
                  auVar42 = vandps_avx512vl(auVar60,auVar274._0_16_);
                  auVar60 = vprolq_avx512vl(auVar42,0x20);
                  auVar42 = vmaxss_avx(auVar60,auVar42);
                  bVar39 = auVar42._0_4_ <= fVar113;
                  if (auVar42._0_4_ < fVar113) {
                    auVar42 = vucomiss_avx512f(auVar56);
                    if (bVar39) {
                      auVar58 = vucomiss_avx512f(auVar42);
                      auVar276 = ZEXT1664(auVar58);
                      if (bVar39) {
                        vmovshdup_avx(auVar42);
                        auVar58 = vucomiss_avx512f(auVar56);
                        if (bVar39) {
                          auVar60 = vucomiss_avx512f(auVar58);
                          auVar276 = ZEXT1664(auVar60);
                          if (bVar39) {
                            auVar45 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128
                                                                  [2]),
                                                    ZEXT416((uint)pre->ray_space[k].vy.field_0.m128
                                                                  [2]),0x1c);
                            auVar53 = vinsertps_avx(auVar45,ZEXT416((uint)pre->ray_space[k].vz.
                                                                          field_0.m128[2]),0x28);
                            auVar45 = vdpps_avx(auVar53,local_2a0,0x7f);
                            auVar46 = vdpps_avx(auVar53,local_2b0,0x7f);
                            auVar47 = vdpps_avx(auVar53,local_2c0,0x7f);
                            auVar48 = vdpps_avx(auVar53,local_2d0,0x7f);
                            auVar49 = vdpps_avx(auVar53,local_2e0,0x7f);
                            auVar50 = vdpps_avx(auVar53,local_2f0,0x7f);
                            auVar52 = vdpps_avx(auVar53,local_300,0x7f);
                            auVar53 = vdpps_avx(auVar53,local_310,0x7f);
                            auVar66 = vsubss_avx512f(auVar60,auVar58);
                            fVar239 = auVar58._0_4_;
                            auVar58 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * auVar49._0_4_)),
                                                      auVar66,auVar45);
                            auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * fVar239)),
                                                      auVar66,auVar46);
                            auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar52._0_4_ * fVar239)),
                                                      auVar66,auVar47);
                            auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * auVar53._0_4_)),
                                                      auVar66,auVar48);
                            auVar60 = vsubss_avx512f(auVar60,auVar42);
                            auVar185._0_4_ = auVar60._0_4_;
                            fVar239 = auVar185._0_4_ * auVar185._0_4_ * auVar185._0_4_;
                            local_120 = auVar42._0_4_;
                            fVar224 = local_120 * 3.0 * auVar185._0_4_ * auVar185._0_4_;
                            fVar234 = auVar185._0_4_ * local_120 * local_120 * 3.0;
                            fVar236 = local_120 * local_120 * local_120;
                            auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * auVar47._0_4_)),
                                                      ZEXT416((uint)fVar234),auVar46);
                            auVar60 = vfmadd231ss_fma(auVar60,ZEXT416((uint)fVar224),auVar45);
                            auVar58 = vfmadd231ss_fma(auVar60,ZEXT416((uint)fVar239),auVar58);
                            fVar235 = auVar58._0_4_;
                            if ((fVar104 <= fVar235) &&
                               (fVar237 = *(float *)(ray + k * 4 + 0x100), fVar235 <= fVar237)) {
                              auVar58 = vshufps_avx(auVar42,auVar42,0x55);
                              auVar45 = vsubps_avx512vl(auVar59,auVar58);
                              fVar238 = auVar58._0_4_;
                              auVar218._0_4_ = fVar238 * (float)local_360._0_4_;
                              fVar195 = auVar58._4_4_;
                              auVar218._4_4_ = fVar195 * (float)local_360._4_4_;
                              fVar196 = auVar58._8_4_;
                              auVar218._8_4_ = fVar196 * fStack_358;
                              fVar197 = auVar58._12_4_;
                              auVar218._12_4_ = fVar197 * fStack_354;
                              auVar221._0_4_ = fVar238 * (float)local_370._0_4_;
                              auVar221._4_4_ = fVar195 * (float)local_370._4_4_;
                              auVar221._8_4_ = fVar196 * fStack_368;
                              auVar221._12_4_ = fVar197 * fStack_364;
                              auVar232._0_4_ = fVar238 * (float)local_380._0_4_;
                              auVar232._4_4_ = fVar195 * (float)local_380._4_4_;
                              auVar232._8_4_ = fVar196 * fStack_378;
                              auVar232._12_4_ = fVar197 * fStack_374;
                              auVar192._0_4_ = fVar238 * (float)local_390._0_4_;
                              auVar192._4_4_ = fVar195 * (float)local_390._4_4_;
                              auVar192._8_4_ = fVar196 * fStack_388;
                              auVar192._12_4_ = fVar197 * fStack_384;
                              auVar58 = vfmadd231ps_fma(auVar218,auVar45,local_320);
                              auVar59 = vfmadd231ps_fma(auVar221,auVar45,local_330);
                              auVar60 = vfmadd231ps_fma(auVar232,auVar45,local_340);
                              auVar45 = vfmadd231ps_fma(auVar192,auVar45,local_350);
                              auVar58 = vsubps_avx(auVar59,auVar58);
                              auVar59 = vsubps_avx(auVar60,auVar59);
                              auVar60 = vsubps_avx(auVar45,auVar60);
                              auVar233._0_4_ = local_120 * auVar59._0_4_;
                              auVar233._4_4_ = local_120 * auVar59._4_4_;
                              auVar233._8_4_ = local_120 * auVar59._8_4_;
                              auVar233._12_4_ = local_120 * auVar59._12_4_;
                              auVar185._4_4_ = auVar185._0_4_;
                              auVar185._8_4_ = auVar185._0_4_;
                              auVar185._12_4_ = auVar185._0_4_;
                              auVar58 = vfmadd231ps_fma(auVar233,auVar185,auVar58);
                              auVar193._0_4_ = local_120 * auVar60._0_4_;
                              auVar193._4_4_ = local_120 * auVar60._4_4_;
                              auVar193._8_4_ = local_120 * auVar60._8_4_;
                              auVar193._12_4_ = local_120 * auVar60._12_4_;
                              auVar59 = vfmadd231ps_fma(auVar193,auVar185,auVar59);
                              auVar194._0_4_ = local_120 * auVar59._0_4_;
                              auVar194._4_4_ = local_120 * auVar59._4_4_;
                              auVar194._8_4_ = local_120 * auVar59._8_4_;
                              auVar194._12_4_ = local_120 * auVar59._12_4_;
                              auVar58 = vfmadd231ps_fma(auVar194,auVar185,auVar58);
                              auVar24._8_4_ = 0x40400000;
                              auVar24._0_8_ = 0x4040000040400000;
                              auVar24._12_4_ = 0x40400000;
                              auVar58 = vmulps_avx512vl(auVar58,auVar24);
                              pGVar8 = (context->scene->geometries).items[uVar36].ptr;
                              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                                bVar27 = 0;
                              }
                              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                      (bVar27 = 1,
                                      pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                auVar169._0_4_ = fVar236 * (float)local_3e0._0_4_;
                                auVar169._4_4_ = fVar236 * (float)local_3e0._4_4_;
                                auVar169._8_4_ = fVar236 * fStack_3d8;
                                auVar169._12_4_ = fVar236 * fStack_3d4;
                                auVar148._4_4_ = fVar234;
                                auVar148._0_4_ = fVar234;
                                auVar148._8_4_ = fVar234;
                                auVar148._12_4_ = fVar234;
                                auVar59 = vfmadd132ps_fma(auVar148,auVar169,local_3d0);
                                auVar140._4_4_ = fVar224;
                                auVar140._0_4_ = fVar224;
                                auVar140._8_4_ = fVar224;
                                auVar140._12_4_ = fVar224;
                                auVar59 = vfmadd132ps_fma(auVar140,auVar59,local_3c0);
                                auVar127._4_4_ = fVar239;
                                auVar127._0_4_ = fVar239;
                                auVar127._8_4_ = fVar239;
                                auVar127._12_4_ = fVar239;
                                auVar45 = vfmadd132ps_fma(auVar127,auVar59,local_3b0);
                                auVar59 = vshufps_avx(auVar45,auVar45,0xc9);
                                auVar60 = vshufps_avx(auVar58,auVar58,0xc9);
                                auVar128._0_4_ = auVar45._0_4_ * auVar60._0_4_;
                                auVar128._4_4_ = auVar45._4_4_ * auVar60._4_4_;
                                auVar128._8_4_ = auVar45._8_4_ * auVar60._8_4_;
                                auVar128._12_4_ = auVar45._12_4_ * auVar60._12_4_;
                                auVar58 = vfmsub231ps_fma(auVar128,auVar58,auVar59);
                                auVar151._8_4_ = 1;
                                auVar151._0_8_ = 0x100000001;
                                auVar151._12_4_ = 1;
                                auVar151._16_4_ = 1;
                                auVar151._20_4_ = 1;
                                auVar151._24_4_ = 1;
                                auVar151._28_4_ = 1;
                                local_100 = vpermps_avx2(auVar151,ZEXT1632(auVar42));
                                auVar89 = vpermps_avx2(auVar151,ZEXT1632(auVar58));
                                auVar173._8_4_ = 2;
                                auVar173._0_8_ = 0x200000002;
                                auVar173._12_4_ = 2;
                                auVar173._16_4_ = 2;
                                auVar173._20_4_ = 2;
                                auVar173._24_4_ = 2;
                                auVar173._28_4_ = 2;
                                local_160 = vpermps_avx2(auVar173,ZEXT1632(auVar58));
                                local_140 = auVar58._0_4_;
                                local_180[0] = (RTCHitN)auVar89[0];
                                local_180[1] = (RTCHitN)auVar89[1];
                                local_180[2] = (RTCHitN)auVar89[2];
                                local_180[3] = (RTCHitN)auVar89[3];
                                local_180[4] = (RTCHitN)auVar89[4];
                                local_180[5] = (RTCHitN)auVar89[5];
                                local_180[6] = (RTCHitN)auVar89[6];
                                local_180[7] = (RTCHitN)auVar89[7];
                                local_180[8] = (RTCHitN)auVar89[8];
                                local_180[9] = (RTCHitN)auVar89[9];
                                local_180[10] = (RTCHitN)auVar89[10];
                                local_180[0xb] = (RTCHitN)auVar89[0xb];
                                local_180[0xc] = (RTCHitN)auVar89[0xc];
                                local_180[0xd] = (RTCHitN)auVar89[0xd];
                                local_180[0xe] = (RTCHitN)auVar89[0xe];
                                local_180[0xf] = (RTCHitN)auVar89[0xf];
                                local_180[0x10] = (RTCHitN)auVar89[0x10];
                                local_180[0x11] = (RTCHitN)auVar89[0x11];
                                local_180[0x12] = (RTCHitN)auVar89[0x12];
                                local_180[0x13] = (RTCHitN)auVar89[0x13];
                                local_180[0x14] = (RTCHitN)auVar89[0x14];
                                local_180[0x15] = (RTCHitN)auVar89[0x15];
                                local_180[0x16] = (RTCHitN)auVar89[0x16];
                                local_180[0x17] = (RTCHitN)auVar89[0x17];
                                local_180[0x18] = (RTCHitN)auVar89[0x18];
                                local_180[0x19] = (RTCHitN)auVar89[0x19];
                                local_180[0x1a] = (RTCHitN)auVar89[0x1a];
                                local_180[0x1b] = (RTCHitN)auVar89[0x1b];
                                local_180[0x1c] = (RTCHitN)auVar89[0x1c];
                                local_180[0x1d] = (RTCHitN)auVar89[0x1d];
                                local_180[0x1e] = (RTCHitN)auVar89[0x1e];
                                local_180[0x1f] = (RTCHitN)auVar89[0x1f];
                                uStack_13c = local_140;
                                uStack_138 = local_140;
                                uStack_134 = local_140;
                                uStack_130 = local_140;
                                uStack_12c = local_140;
                                uStack_128 = local_140;
                                uStack_124 = local_140;
                                fStack_11c = local_120;
                                fStack_118 = local_120;
                                fStack_114 = local_120;
                                fStack_110 = local_120;
                                fStack_10c = local_120;
                                fStack_108 = local_120;
                                fStack_104 = local_120;
                                local_e0 = local_1e0._0_8_;
                                uStack_d8 = local_1e0._8_8_;
                                uStack_d0 = local_1e0._16_8_;
                                uStack_c8 = local_1e0._24_8_;
                                local_c0 = local_200;
                                vpcmpeqd_avx2(local_200,local_200);
                                uStack_9c = context->user->instID[0];
                                local_a0 = uStack_9c;
                                uStack_98 = uStack_9c;
                                uStack_94 = uStack_9c;
                                uStack_90 = uStack_9c;
                                uStack_8c = uStack_9c;
                                uStack_88 = uStack_9c;
                                uStack_84 = uStack_9c;
                                uStack_7c = context->user->instPrimID[0];
                                local_80 = uStack_7c;
                                uStack_78 = uStack_7c;
                                uStack_74 = uStack_7c;
                                uStack_70 = uStack_7c;
                                uStack_6c = uStack_7c;
                                uStack_68 = uStack_7c;
                                uStack_64 = uStack_7c;
                                *(float *)(ray + k * 4 + 0x100) = fVar235;
                                local_400 = local_220;
                                local_430.valid = (int *)local_400;
                                local_430.geometryUserPtr = pGVar8->userPtr;
                                local_430.context = context->user;
                                local_430.ray = (RTCRayN *)ray;
                                local_430.hit = local_180;
                                local_430.N = 8;
                                if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar8->occlusionFilterN)(&local_430);
                                  auVar276 = ZEXT464(0x3f800000);
                                  auVar42 = vxorps_avx512vl(auVar56,auVar56);
                                  auVar271 = ZEXT1664(auVar42);
                                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar275 = ZEXT1664(auVar42);
                                }
                                auVar42 = auVar271._0_16_;
                                if (local_400 == (undefined1  [32])0x0) {
                                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar274 = ZEXT1664(auVar42);
                                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar277 = ZEXT1664(auVar42);
                                  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar272 = ZEXT3264(auVar89);
                                  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                  auVar273 = ZEXT1664(auVar42);
                                  in_ZMM24 = ZEXT3264(_DAT_01feed20);
                                }
                                else {
                                  p_Var13 = context->args->filter;
                                  if (p_Var13 == (RTCFilterFunctionN)0x0) {
                                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar274 = ZEXT1664(auVar42);
                                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                    auVar277 = ZEXT1664(auVar42);
                                    auVar89 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar272 = ZEXT3264(auVar89);
                                    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                    auVar273 = ZEXT1664(auVar42);
                                    in_ZMM24 = ZEXT3264(_DAT_01feed20);
                                  }
                                  else {
                                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar274 = ZEXT1664(auVar56);
                                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                    auVar277 = ZEXT1664(auVar56);
                                    auVar89 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar272 = ZEXT3264(auVar89);
                                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                    auVar273 = ZEXT1664(auVar56);
                                    in_ZMM24 = ZEXT3264(_DAT_01feed20);
                                    if (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                       (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                                      (*p_Var13)(&local_430);
                                      in_ZMM24 = ZEXT3264(_DAT_01feed20);
                                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                      auVar273 = ZEXT1664(auVar56);
                                      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      auVar272 = ZEXT3264(auVar89);
                                      auVar276 = ZEXT464(0x3f800000);
                                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                      auVar277 = ZEXT1664(auVar56);
                                      auVar42 = vxorps_avx512vl(auVar42,auVar42);
                                      auVar271 = ZEXT1664(auVar42);
                                      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar275 = ZEXT1664(auVar42);
                                      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar274 = ZEXT1664(auVar42);
                                    }
                                  }
                                  uVar3 = vptestmd_avx512vl(local_400,local_400);
                                  auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  bVar39 = (bool)((byte)uVar3 & 1);
                                  bVar40 = (bool)((byte)(uVar3 >> 1) & 1);
                                  bVar37 = (bool)((byte)(uVar3 >> 2) & 1);
                                  bVar38 = (bool)((byte)(uVar3 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar3 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
                                  bVar17 = SUB81(uVar3 >> 7,0);
                                  *(uint *)(local_430.ray + 0x100) =
                                       (uint)bVar39 * auVar89._0_4_ |
                                       (uint)!bVar39 * *(int *)(local_430.ray + 0x100);
                                  *(uint *)(local_430.ray + 0x104) =
                                       (uint)bVar40 * auVar89._4_4_ |
                                       (uint)!bVar40 * *(int *)(local_430.ray + 0x104);
                                  *(uint *)(local_430.ray + 0x108) =
                                       (uint)bVar37 * auVar89._8_4_ |
                                       (uint)!bVar37 * *(int *)(local_430.ray + 0x108);
                                  *(uint *)(local_430.ray + 0x10c) =
                                       (uint)bVar38 * auVar89._12_4_ |
                                       (uint)!bVar38 * *(int *)(local_430.ray + 0x10c);
                                  *(uint *)(local_430.ray + 0x110) =
                                       (uint)bVar14 * auVar89._16_4_ |
                                       (uint)!bVar14 * *(int *)(local_430.ray + 0x110);
                                  *(uint *)(local_430.ray + 0x114) =
                                       (uint)bVar15 * auVar89._20_4_ |
                                       (uint)!bVar15 * *(int *)(local_430.ray + 0x114);
                                  *(uint *)(local_430.ray + 0x118) =
                                       (uint)bVar16 * auVar89._24_4_ |
                                       (uint)!bVar16 * *(int *)(local_430.ray + 0x118);
                                  *(uint *)(local_430.ray + 0x11c) =
                                       (uint)bVar17 * auVar89._28_4_ |
                                       (uint)!bVar17 * *(int *)(local_430.ray + 0x11c);
                                  bVar27 = 1;
                                  if (local_400 != (undefined1  [32])0x0) goto LAB_01bccc42;
                                }
                                *(float *)(ray + k * 4 + 0x100) = fVar237;
                                bVar27 = 0;
                              }
LAB_01bccc42:
                              bVar35 = (bool)(bVar35 | bVar27);
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar31 = lVar31 + -1;
                } while (lVar31 != 0);
              }
            }
          }
          if (uVar28 == 0) break;
        } while( true );
      }
      if (bVar35) {
        return bVar35;
      }
      uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar23._4_4_ = uVar105;
      auVar23._0_4_ = uVar105;
      auVar23._8_4_ = uVar105;
      auVar23._12_4_ = uVar105;
      uVar18 = vcmpps_avx512vl(local_3a0,auVar23,2);
      uVar36 = (uint)uVar41 & (uint)uVar41 + 0xf & (uint)uVar18;
      uVar41 = (ulong)uVar36;
    } while (uVar36 != 0);
  }
  return bVar35;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }